

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O3

int ncnn::convolution_im2col_gemm_int8
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,int kernel_w,int kernel_h,int dilation_w,
              int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [32];
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  int *piVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  undefined8 *puVar23;
  undefined1 *puVar24;
  ulong uVar25;
  int iVar26;
  undefined1 (*pauVar27) [64];
  undefined1 (*pauVar28) [64];
  int M;
  uint uVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  undefined4 in_register_00000084;
  long lVar48;
  undefined1 (*pauVar49) [64];
  long lVar50;
  long lVar51;
  long lVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  long lVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  __m128i _vindex;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2a8;
  int TILE_N;
  int local_26c;
  ulong local_268;
  int TILE_K;
  int TILE_M;
  ulong local_258;
  long local_250;
  Mat *local_248;
  undefined8 local_240;
  ulong local_238;
  int local_22c;
  Mat local_228;
  ulong local_1e0;
  uint local_1d4;
  long local_1d0;
  Mat local_1c8;
  Mat m;
  Mat local_108;
  Mat local_c0;
  undefined1 local_78 [64];
  
  local_250 = CONCAT44(in_register_00000084,kernel_h);
  iVar57 = kernel_h * kernel_w;
  M = top_blob->elempack * top_blob->c;
  uVar53 = top_blob->h * top_blob->w;
  uVar58 = bottom_blob->c * iVar57 * bottom_blob->elempack;
  local_248 = top_blob;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8(M,uVar53,uVar58,&TILE_M,&TILE_N,&TILE_K,nT);
  iVar47 = TILE_M;
  iVar14 = TILE_N;
  local_22c = (M + TILE_M + -1) / TILE_M;
  iVar21 = (int)(uVar53 + TILE_N + -1) / TILE_N;
  local_26c = (int)(uVar58 + TILE_K + -1) / TILE_K;
  local_1c8.cstep = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  local_1e0 = (ulong)uVar53;
  Mat::create(&local_1c8,TILE_K * TILE_N,local_26c,iVar21,1,opt->workspace_allocator);
  iVar44 = -100;
  if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
    uVar53 = iVar21 * local_26c;
    local_238 = (ulong)uVar58;
    if (0 < (int)uVar53) {
      iVar44 = (int)local_250;
      auVar73 = vpbroadcastd_avx512f();
      local_78 = vmovdqu64_avx512f(auVar73);
      uVar17 = 0;
      do {
        iVar14 = (int)uVar17 / local_26c;
        uVar25 = (long)(int)uVar17 % (long)local_26c;
        iVar47 = TILE_N * iVar14;
        iVar21 = TILE_K * (int)uVar25;
        uVar58 = (int)local_1e0 - iVar47;
        if (TILE_N < (int)uVar58) {
          uVar58 = TILE_N;
        }
        uVar54 = (int)local_238 - iVar21;
        if (TILE_K < (int)uVar54) {
          uVar54 = TILE_K;
        }
        local_228.cstep = (size_t)local_1c8.w;
        local_228.data =
             (void *)((long)local_1c8.data +
                     (uVar25 & 0xffffffff) * local_228.cstep * local_1c8.elemsize +
                     (long)iVar14 * local_1c8.cstep * local_1c8.elemsize);
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize = local_1c8.elemsize;
        local_228.elempack = local_1c8.elempack;
        local_228.allocator = local_1c8.allocator;
        local_228.dims = 2;
        local_228.w = local_1c8.w;
        local_228.h = 1;
        local_228.d = 1;
        local_228.c = 1;
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
        local_258 = uVar17;
        iVar14 = cpu_support_x86_avx512_vnni();
        if (iVar14 == 0) {
          iVar14 = cpu_support_x86_avx_vnni_int8();
          if (iVar14 == 0) {
            iVar14 = cpu_support_x86_avx_vnni();
            if (iVar14 == 0) {
              sVar6 = bottom_blob->cstep;
              iVar14 = (int)sVar6;
              if ((stride_h == 1 &&
                  (dilation_h == 1 && (dilation_w == 1 && (iVar44 == 1 && kernel_w == 1)))) &&
                  stride_w == 1) {
                iVar3 = bottom_blob->elempack;
                uVar17 = 0;
                pauVar28 = (undefined1 (*) [64])local_228.data;
                if (0xf < (int)uVar58) {
                  iVar30 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar30 = iVar21;
                  }
                  uVar29 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar29 = uVar54;
                  }
                  lVar52 = (long)iVar47;
                  lVar20 = lVar52 * 8 + 0x40;
                  uVar25 = 0;
                  do {
                    if (iVar3 == 8) {
                      if (7 < (int)uVar54) {
                        pauVar61 = (undefined1 (*) [16])
                                   (bottom_blob->cstep * (long)(iVar30 >> 3) * bottom_blob->elemsize
                                    + lVar20 + (long)bottom_blob->data);
                        iVar39 = (int)uVar29 >> 3;
                        do {
                          auVar64 = vpunpcklwd_avx(pauVar61[-4],pauVar61[-3]);
                          auVar65 = vpunpckhwd_avx(pauVar61[-4],pauVar61[-3]);
                          auVar109 = vpunpcklwd_avx(pauVar61[-2],pauVar61[-1]);
                          auVar62 = vpunpckhwd_avx(pauVar61[-2],pauVar61[-1]);
                          auVar108 = vpunpcklwd_avx(*pauVar61,pauVar61[1]);
                          auVar63 = vpunpckhwd_avx(*pauVar61,pauVar61[1]);
                          auVar102 = vpunpcklwd_avx(pauVar61[2],pauVar61[3]);
                          auVar106 = vpunpckhwd_avx(pauVar61[2],pauVar61[3]);
                          auVar104 = vpunpcklwd_avx(auVar64,auVar65);
                          auVar65 = vpunpckhwd_avx(auVar64,auVar65);
                          auVar64 = vpunpcklwd_avx(auVar109,auVar62);
                          auVar62 = vpunpckhwd_avx(auVar109,auVar62);
                          auVar109 = vpunpcklwd_avx(auVar108,auVar63);
                          auVar63 = vpunpckhwd_avx(auVar108,auVar63);
                          auVar108 = vpunpcklwd_avx(auVar102,auVar106);
                          auVar106 = vpunpckhwd_avx(auVar102,auVar106);
                          auVar102 = vpunpcklqdq_avx(auVar104,auVar64);
                          auVar103 = vpunpcklqdq_avx(auVar109,auVar108);
                          in_ZMM9 = ZEXT1664(auVar103);
                          auVar64 = vpunpckhqdq_avx(auVar104,auVar64);
                          auVar109 = vpunpckhqdq_avx(auVar109,auVar108);
                          auVar108 = vpunpcklqdq_avx(auVar65,auVar62);
                          auVar104 = vpunpcklqdq_avx(auVar63,auVar106);
                          in_ZMM8 = ZEXT1664(auVar104);
                          auVar65 = vpunpckhqdq_avx(auVar65,auVar62);
                          auVar62 = vpunpckhqdq_avx(auVar63,auVar106);
                          *(undefined1 (*) [16])*pauVar28 = auVar102;
                          *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar103;
                          *(undefined1 (*) [16])(*pauVar28 + 0x20) = auVar64;
                          *(undefined1 (*) [16])(*pauVar28 + 0x30) = auVar109;
                          *(undefined1 (*) [16])pauVar28[1] = auVar108;
                          *(undefined1 (*) [16])(pauVar28[1] + 0x10) = auVar104;
                          *(undefined1 (*) [16])(pauVar28[1] + 0x20) = auVar65;
                          *(undefined1 (*) [16])(pauVar28[1] + 0x30) = auVar62;
                          pauVar28 = pauVar28 + 2;
                          pauVar61 = (undefined1 (*) [16])(*pauVar61 + iVar14 * 8);
                          iVar39 = iVar39 + -1;
                        } while (iVar39 != 0);
                        goto LAB_001b1b65;
                      }
                    }
                    else {
LAB_001b1b65:
                      if (iVar3 == 1) {
                        lVar18 = bottom_blob->cstep * (long)iVar21 * bottom_blob->elemsize;
                        if ((int)uVar54 < 2) {
                          pauVar61 = (undefined1 (*) [16])
                                     ((long)bottom_blob->data + lVar18 + lVar52 + uVar25);
                          uVar55 = 0;
                        }
                        else {
                          lVar18 = (long)bottom_blob->data + lVar18 + uVar25;
                          iVar39 = 1;
                          do {
                            auVar65 = *(undefined1 (*) [16])(lVar18 + lVar52 + iVar14);
                            auVar62 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar18 + lVar52),auVar65
                                                    );
                            auVar65 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar18 + lVar52),auVar65
                                                    );
                            *(undefined1 (*) [16])*pauVar28 = auVar62;
                            *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar65;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                            lVar18 = lVar18 + iVar14 * 2;
                            iVar39 = iVar39 + 2;
                          } while (iVar39 < (int)uVar54);
                          pauVar61 = (undefined1 (*) [16])(lVar18 + lVar52);
                          uVar55 = uVar54 & 0xfffffffe;
                        }
                        iVar39 = uVar54 - uVar55;
                        if (iVar39 != 0 && (int)uVar55 <= (int)uVar54) {
                          do {
                            *(undefined1 (*) [16])*pauVar28 = *pauVar61;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            pauVar61 = (undefined1 (*) [16])(*pauVar61 + iVar14);
                            iVar39 = iVar39 + -1;
                          } while (iVar39 != 0);
                        }
                      }
                    }
                    uVar17 = uVar25 + 0x10;
                    uVar38 = uVar25 + 0x1f;
                    lVar20 = lVar20 + 0x80;
                    uVar25 = uVar17;
                  } while (uVar38 < uVar58);
                }
                if ((int)((uint)uVar17 | 7) < (int)uVar58) {
                  iVar30 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar30 = iVar21;
                  }
                  uVar29 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar29 = uVar54;
                  }
                  lVar18 = (long)iVar47;
                  lVar20 = lVar18 + (uVar17 & 0xffffffff);
                  lVar52 = lVar20 + iVar14;
                  uVar25 = uVar17 & 0xffffffff;
                  do {
                    if (iVar3 == 8) {
                      if (7 < (int)uVar54) {
                        pauVar61 = (undefined1 (*) [16])
                                   ((long)bottom_blob->data +
                                   (lVar18 + uVar25) * 8 +
                                   bottom_blob->cstep * (long)(iVar30 >> 3) * bottom_blob->elemsize)
                        ;
                        iVar39 = (int)uVar29 >> 3;
                        do {
                          auVar63 = vpunpcklwd_avx(*pauVar61,pauVar61[1]);
                          auVar65 = vpunpckhwd_avx(*pauVar61,pauVar61[1]);
                          auVar106 = vpunpcklwd_avx(pauVar61[2],pauVar61[3]);
                          auVar62 = vpunpckhwd_avx(pauVar61[2],pauVar61[3]);
                          auVar64 = vpunpcklwd_avx(auVar63,auVar65);
                          auVar65 = vpunpckhwd_avx(auVar63,auVar65);
                          auVar63 = vpunpcklwd_avx(auVar106,auVar62);
                          auVar62 = vpunpckhwd_avx(auVar106,auVar62);
                          auVar106 = vpunpcklqdq_avx(auVar64,auVar63);
                          auVar63 = vpunpckhqdq_avx(auVar64,auVar63);
                          auVar64 = vpunpcklqdq_avx(auVar65,auVar62);
                          auVar65 = vpunpckhqdq_avx(auVar65,auVar62);
                          *(undefined1 (*) [16])*pauVar28 = auVar106;
                          *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar63;
                          *(undefined1 (*) [16])(*pauVar28 + 0x20) = auVar64;
                          *(undefined1 (*) [16])(*pauVar28 + 0x30) = auVar65;
                          pauVar28 = pauVar28 + 1;
                          pauVar61 = (undefined1 (*) [16])(*pauVar61 + iVar14 * 8);
                          iVar39 = iVar39 + -1;
                        } while (iVar39 != 0);
                        goto LAB_001b1d35;
                      }
                    }
                    else {
LAB_001b1d35:
                      if (iVar3 == 1) {
                        pvVar7 = bottom_blob->data;
                        lVar19 = bottom_blob->cstep * (long)iVar21 * bottom_blob->elemsize;
                        if ((int)uVar54 < 2) {
                          lVar32 = (long)pvVar7 + lVar18 + uVar25;
                          uVar55 = 0;
                        }
                        else {
                          lVar32 = (long)pvVar7 + lVar20;
                          lVar33 = (long)pvVar7 + lVar52;
                          iVar39 = 1;
                          do {
                            auVar102._8_8_ = 0;
                            auVar102._0_8_ = *(ulong *)(lVar32 + lVar19);
                            auVar104._8_8_ = 0;
                            auVar104._0_8_ = *(ulong *)(lVar33 + lVar19);
                            auVar65 = vpunpcklbw_avx(auVar102,auVar104);
                            *(undefined1 (*) [16])*pauVar28 = auVar65;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            lVar32 = lVar32 + iVar14 * 2;
                            lVar33 = lVar33 + iVar14 * 2;
                            iVar39 = iVar39 + 2;
                            uVar55 = uVar54 & 0xfffffffe;
                          } while (iVar39 < (int)uVar54);
                        }
                        puVar23 = (undefined8 *)(lVar32 + lVar19);
                        iVar39 = uVar54 - uVar55;
                        if (iVar39 != 0 && (int)uVar55 <= (int)uVar54) {
                          do {
                            *(undefined8 *)*pauVar28 = *puVar23;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            puVar23 = (undefined8 *)((long)puVar23 + (long)iVar14);
                            iVar39 = iVar39 + -1;
                          } while (iVar39 != 0);
                        }
                      }
                    }
                    uVar17 = uVar25 + 8;
                    lVar19 = uVar25 + 0xf;
                    lVar20 = lVar20 + 8;
                    lVar52 = lVar52 + 8;
                    uVar25 = uVar17;
                  } while (lVar19 < (int)uVar58);
                }
                if ((int)((uint)uVar17 | 3) < (int)uVar58) {
                  iVar30 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar30 = iVar21;
                  }
                  local_240 = (ulong)(iVar30 >> 3);
                  uVar29 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar29 = uVar54;
                  }
                  local_268 = CONCAT44(local_268._4_4_,(int)uVar29 >> 3);
                  lVar18 = sVar6 << 0x20;
                  lVar52 = (long)(iVar14 * 2);
                  local_1d4 = uVar54 & 0xfffffffe;
                  local_1d0 = (long)(int)uVar58;
                  local_2a8 = (long)iVar47 + (uVar17 & 0xffffffff);
                  lVar20 = local_2a8 * 8 + 0x10;
                  lVar19 = (lVar18 + 0x300000000 >> 0x20) + local_2a8;
                  local_2b8 = local_2a8 + iVar14;
                  local_2c8 = (lVar18 + 0x200000000 >> 0x20) + local_2a8;
                  local_2c0 = (lVar18 + 0x100000000 >> 0x20) + local_2a8;
                  uVar25 = uVar17 & 0xffffffff;
                  do {
                    if (iVar3 == 8) {
                      if (7 < (int)uVar54) {
                        lVar18 = bottom_blob->cstep * local_240 * bottom_blob->elemsize;
                        lVar32 = (long)bottom_blob->data + lVar20;
                        iVar30 = (int)uVar29 >> 3;
                        do {
                          auVar65 = *(undefined1 (*) [16])(lVar32 + -0x10 + lVar18);
                          auVar62 = *(undefined1 (*) [16])(lVar32 + lVar18);
                          auVar63 = vpunpcklwd_avx(auVar65,auVar62);
                          auVar65 = vpunpckhwd_avx(auVar65,auVar62);
                          auVar62 = vpunpcklwd_avx(auVar63,auVar65);
                          auVar65 = vpunpckhwd_avx(auVar63,auVar65);
                          *(undefined1 (*) [16])*pauVar28 = auVar62;
                          *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar65;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                          lVar32 = lVar32 + iVar14 * 8;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                        goto LAB_001b1f55;
                      }
                    }
                    else {
LAB_001b1f55:
                      if (iVar3 == 1) {
                        pvVar7 = bottom_blob->data;
                        lVar18 = bottom_blob->cstep * (long)iVar21 * bottom_blob->elemsize;
                        if ((int)uVar54 < 2) {
                          lVar32 = (long)pvVar7 + (long)iVar47 + uVar25;
                          uVar55 = 0;
                        }
                        else {
                          lVar32 = (long)pvVar7 + local_2a8;
                          lVar33 = (long)pvVar7 + lVar19;
                          lVar34 = (long)pvVar7 + local_2b8;
                          lVar35 = (long)pvVar7 + local_2c8;
                          lVar36 = (long)pvVar7 + local_2c0;
                          iVar30 = 1;
                          do {
                            (*pauVar28)[0] = *(undefined1 *)(lVar32 + lVar18);
                            (*pauVar28)[1] = *(undefined1 *)(lVar34 + lVar18);
                            (*pauVar28)[2] = *(undefined1 *)(lVar32 + 1 + lVar18);
                            (*pauVar28)[3] = *(undefined1 *)(lVar36 + lVar18);
                            (*pauVar28)[4] = *(undefined1 *)(lVar32 + 2 + lVar18);
                            (*pauVar28)[5] = *(undefined1 *)(lVar35 + lVar18);
                            (*pauVar28)[6] = *(undefined1 *)(lVar32 + 3 + lVar18);
                            (*pauVar28)[7] = *(undefined1 *)(lVar33 + lVar18);
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            iVar30 = iVar30 + 2;
                            lVar32 = lVar32 + lVar52;
                            lVar33 = lVar33 + lVar52;
                            lVar34 = lVar34 + lVar52;
                            lVar35 = lVar35 + lVar52;
                            lVar36 = lVar36 + lVar52;
                            uVar55 = local_1d4;
                          } while (iVar30 < (int)uVar54);
                        }
                        iVar30 = uVar54 - uVar55;
                        if (iVar30 != 0 && (int)uVar55 <= (int)uVar54) {
                          puVar24 = (undefined1 *)(lVar32 + lVar18 + 3);
                          do {
                            (*pauVar28)[0] = puVar24[-3];
                            (*pauVar28)[1] = puVar24[-2];
                            (*pauVar28)[2] = puVar24[-1];
                            (*pauVar28)[3] = *puVar24;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            puVar24 = puVar24 + iVar14;
                            iVar30 = iVar30 + -1;
                          } while (iVar30 != 0);
                        }
                      }
                    }
                    uVar17 = uVar25 + 4;
                    lVar18 = uVar25 + 7;
                    lVar20 = lVar20 + 0x20;
                    local_2a8 = local_2a8 + 4;
                    lVar19 = lVar19 + 4;
                    local_2b8 = local_2b8 + 4;
                    local_2c8 = local_2c8 + 4;
                    local_2c0 = local_2c0 + 4;
                    uVar25 = uVar17;
                  } while (lVar18 < local_1d0);
                }
                uVar29 = (uint)uVar17;
                if ((int)(uVar29 | 1) < (int)uVar58) {
                  iVar30 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar30 = iVar21;
                  }
                  uVar55 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar55 = uVar54;
                  }
                  lVar19 = (long)(iVar14 * 2);
                  local_240 = CONCAT44(local_240._4_4_,uVar54) & 0xfffffffffffffffe;
                  local_268 = (ulong)iVar47;
                  lVar20 = (long)(int)uVar29 + local_268;
                  lVar52 = lVar20 * 8 + 8;
                  lVar18 = (iVar14 + 1) + lVar20;
                  local_2c8 = lVar20 + iVar14;
                  uVar25 = (long)(int)uVar29;
                  do {
                    if (iVar3 == 8) {
                      if (7 < (int)uVar54) {
                        lVar32 = bottom_blob->cstep * (long)(iVar30 >> 3) * bottom_blob->elemsize;
                        lVar33 = (long)bottom_blob->data + lVar52;
                        iVar39 = (int)uVar55 >> 3;
                        do {
                          auVar103._8_8_ = 0;
                          auVar103._0_8_ = *(ulong *)(lVar33 + -8 + lVar32);
                          auVar105._8_8_ = 0;
                          auVar105._0_8_ = *(ulong *)(lVar33 + lVar32);
                          auVar65 = vpunpcklwd_avx(auVar103,auVar105);
                          *(undefined1 (*) [16])*pauVar28 = auVar65;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                          lVar33 = lVar33 + iVar14 * 8;
                          iVar39 = iVar39 + -1;
                        } while (iVar39 != 0);
                        goto LAB_001b21c2;
                      }
                    }
                    else {
LAB_001b21c2:
                      if (iVar3 == 1) {
                        pvVar7 = bottom_blob->data;
                        lVar32 = bottom_blob->cstep * (long)iVar21 * bottom_blob->elemsize;
                        if ((int)uVar54 < 2) {
                          lVar33 = (long)pvVar7 + local_268 + uVar25;
                          iVar39 = 0;
                        }
                        else {
                          lVar33 = (long)pvVar7 + lVar20;
                          lVar34 = (long)pvVar7 + lVar18;
                          lVar35 = (long)pvVar7 + local_2c8;
                          iVar39 = 1;
                          do {
                            (*pauVar28)[0] = *(undefined1 *)(lVar33 + lVar32);
                            (*pauVar28)[1] = *(undefined1 *)(lVar35 + lVar32);
                            (*pauVar28)[2] = *(undefined1 *)(lVar33 + 1 + lVar32);
                            (*pauVar28)[3] = *(undefined1 *)(lVar34 + lVar32);
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            iVar39 = iVar39 + 2;
                            lVar33 = lVar33 + lVar19;
                            lVar34 = lVar34 + lVar19;
                            lVar35 = lVar35 + lVar19;
                          } while (iVar39 < (int)uVar54);
                          iVar39 = (int)local_240;
                        }
                        iVar40 = uVar54 - iVar39;
                        if (iVar40 != 0 && iVar39 <= (int)uVar54) {
                          puVar24 = (undefined1 *)(lVar33 + lVar32 + 1);
                          do {
                            (*pauVar28)[0] = puVar24[-1];
                            (*pauVar28)[1] = *puVar24;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 2);
                            puVar24 = puVar24 + iVar14;
                            iVar40 = iVar40 + -1;
                          } while (iVar40 != 0);
                        }
                      }
                    }
                    uVar17 = uVar25 + 2;
                    lVar32 = uVar25 + 3;
                    lVar52 = lVar52 + 0x10;
                    lVar20 = lVar20 + 2;
                    lVar18 = lVar18 + 2;
                    local_2c8 = local_2c8 + 2;
                    uVar25 = uVar17;
                  } while (lVar32 < (int)uVar58);
                }
                if ((int)uVar17 < (int)uVar58) {
                  iVar30 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar30 = iVar21;
                  }
                  uVar29 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar29 = uVar54;
                  }
                  lVar20 = (long)(int)uVar17;
                  do {
                    if (iVar3 == 8) {
                      if (7 < (int)uVar54) {
                        puVar23 = (undefined8 *)
                                  ((long)bottom_blob->data +
                                  (lVar20 + iVar47) * 8 +
                                  bottom_blob->cstep * (long)(iVar30 >> 3) * bottom_blob->elemsize);
                        iVar39 = (int)uVar29 >> 3;
                        do {
                          *(undefined8 *)*pauVar28 = *puVar23;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                          puVar23 = (undefined8 *)((long)puVar23 + (long)(iVar14 * 8));
                          iVar39 = iVar39 + -1;
                        } while (iVar39 != 0);
                        goto LAB_001b2352;
                      }
                    }
                    else {
LAB_001b2352:
                      if (iVar3 == 1 && 0 < (int)uVar54) {
                        puVar24 = (undefined1 *)
                                  ((long)bottom_blob->data +
                                  (long)iVar47 +
                                  lVar20 + bottom_blob->cstep * (long)iVar21 * bottom_blob->elemsize
                                  );
                        uVar55 = uVar54;
                        do {
                          (*pauVar28)[0] = *puVar24;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 1);
                          puVar24 = puVar24 + iVar14;
                          uVar55 = uVar55 - 1;
                        } while (uVar55 != 0);
                      }
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != (int)uVar58);
                }
              }
              else {
                iVar3 = bottom_blob->elempack;
                uVar29 = bottom_blob->w;
                local_268 = (ulong)uVar29;
                uVar55 = (int)(~((kernel_w + -1) * dilation_w) + uVar29) / stride_w;
                iVar30 = uVar55 + 1;
                uVar42 = 0;
                if (uVar55 == 0) {
                  uVar31 = 0;
                  uVar55 = 0;
                }
                else {
                  uVar31 = 0x1f;
                  if (uVar55 != 0) {
                    for (; uVar55 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                    }
                  }
                  uVar55 = 1;
                }
                auVar73 = vpbroadcastd_avx512f();
                auVar65 = ZEXT416(uVar31);
                pauVar28 = (undefined1 (*) [64])local_228.data;
                if (0xf < (int)uVar58) {
                  auVar76 = vpbroadcastd_avx512f(ZEXT416(uVar55));
                  iVar39 = uVar29 * dilation_h;
                  uVar31 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar31 = uVar54;
                  }
                  auVar75 = vpbroadcastd_avx512f();
                  iVar40 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar40 = iVar21;
                  }
                  auVar74 = vpbroadcastd_avx512f();
                  uVar22 = 0;
                  do {
                    auVar77 = vpbroadcastd_avx512f();
                    auVar77 = vpaddd_avx512f(auVar77,_DAT_005b4580);
                    auVar78 = vpmuludq_avx512f(auVar77,auVar73);
                    auVar78 = vpsrlq_avx512f(auVar78,0x20);
                    auVar79 = vpsrlq_avx512f(auVar77,0x20);
                    auVar79 = vpmuludq_avx512f(auVar79,auVar73);
                    auVar79 = vmovdqa32_avx512f(auVar79);
                    auVar80._4_4_ = auVar79._4_4_;
                    auVar80._0_4_ = auVar78._0_4_;
                    auVar80._8_4_ = auVar78._8_4_;
                    auVar80._12_4_ = auVar79._12_4_;
                    auVar80._16_4_ = auVar78._16_4_;
                    auVar80._20_4_ = auVar79._20_4_;
                    auVar80._24_4_ = auVar78._24_4_;
                    auVar80._28_4_ = auVar79._28_4_;
                    auVar80._32_4_ = auVar78._32_4_;
                    auVar80._36_4_ = auVar79._36_4_;
                    auVar80._40_4_ = auVar78._40_4_;
                    auVar80._44_4_ = auVar79._44_4_;
                    auVar80._48_4_ = auVar78._48_4_;
                    auVar80._52_4_ = auVar79._52_4_;
                    auVar80._60_4_ = auVar79._60_4_;
                    auVar80._56_4_ = auVar78._56_4_;
                    auVar78 = vpsubd_avx512f(auVar77,auVar80);
                    auVar78 = vpsrlvd_avx512f(auVar78,auVar76);
                    auVar78 = vpaddd_avx512f(auVar78,auVar80);
                    auVar78 = vpsrld_avx512f(auVar78,auVar65);
                    in_ZMM8 = vpmulld_avx512f(auVar78,auVar74);
                    auVar77 = vpsubd_avx512f(auVar77,in_ZMM8);
                    auVar77 = vpmulld_avx512f(auVar77,local_78);
                    auVar78 = vpmulld_avx512f(auVar78,auVar75);
                    if (stride_w == 1) {
                      in_ZMM8 = valignd_avx512f(auVar78,auVar78,0xf);
                      uVar17 = vpcmpeqd_avx512f(auVar78,in_ZMM8);
                      if ((uVar17 & 1) == 0) goto LAB_001b2666;
                      auVar62 = vpaddd_avx(auVar77._0_16_,auVar78._0_16_);
                      iVar16 = auVar62._0_4_;
                      if (iVar3 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar54) {
                          iVar41 = 0;
                          do {
                            uVar17 = (long)(iVar21 + iVar41) % (long)iVar57;
                            iVar15 = iVar21 + iVar41 + 1;
                            uVar25 = (long)iVar15 % (long)iVar57;
                            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff;
                            uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                     uVar25 & 0xffffffff;
                            auVar62 = *(undefined1 (*) [16])
                                       ((long)bottom_blob->data +
                                       (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                              ((iVar21 + iVar41) / iVar57) * iVar14 + iVar16 +
                                             (int)((long)uVar17 / (long)kernel_w) * iVar39));
                            auVar63 = *(undefined1 (*) [16])
                                       ((long)bottom_blob->data +
                                       (long)((int)((long)uVar25 % (long)kernel_w) * dilation_w +
                                              (iVar15 / iVar57) * iVar14 + iVar16 +
                                             (int)((long)uVar25 / (long)kernel_w) * iVar39));
                            auVar106 = vpunpcklbw_avx(auVar62,auVar63);
                            in_ZMM8 = ZEXT1664(auVar106);
                            auVar62 = vpunpckhbw_avx(auVar62,auVar63);
                            *(undefined1 (*) [16])*pauVar28 = auVar106;
                            *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar62;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                            iVar15 = iVar41 + 2;
                            iVar59 = iVar41 + 3;
                            iVar41 = iVar15;
                          } while (iVar59 < (int)uVar54);
                        }
                        iVar41 = uVar54 - iVar15;
                        if (iVar41 != 0 && iVar15 <= (int)uVar54) {
                          iVar15 = iVar15 + iVar21;
                          do {
                            uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                            *(undefined1 (*) [16])*pauVar28 =
                                 *(undefined1 (*) [16])
                                  ((long)bottom_blob->data +
                                  (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                         (iVar15 / iVar57) * iVar14 + iVar16 +
                                        (int)((long)uVar17 / (long)kernel_w) * iVar39));
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            iVar15 = iVar15 + 1;
                            iVar41 = iVar41 + -1;
                          } while (iVar41 != 0);
                        }
                      }
                      iVar15 = iVar40 >> 3;
                      uVar42 = (int)uVar31 >> 3;
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                          lVar20 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                          (iVar15 / iVar57) * iVar14 + iVar16 +
                                         (int)((long)uVar17 / (long)kernel_w) * iVar39);
                          auVar77 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                       ((long)bottom_blob->data + lVar20 * 8));
                          auVar78 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                       ((long)bottom_blob->data + lVar20 * 8 + 0x40)
                                                     );
                          auVar79 = vpunpcklwd_avx512bw(auVar77,auVar78);
                          auVar77 = vpunpckhwd_avx512bw(auVar77,auVar78);
                          auVar78 = vpunpcklwd_avx512bw(auVar79,auVar77);
                          auVar77 = vpunpckhwd_avx512bw(auVar79,auVar77);
                          auVar79 = vshufi64x2_avx512f(auVar78,auVar77,0x88);
                          auVar77 = vshufi64x2_avx512f(auVar78,auVar77,0xdd);
                          auVar78 = vpunpckldq_avx512f(auVar79,auVar77);
                          auVar77 = vpunpckhdq_avx512f(auVar79,auVar77);
                          auVar79 = vshufi64x2_avx512f(auVar78,auVar77,0x88);
                          auVar77 = vshufi64x2_avx512f(auVar78,auVar77,0xdd);
                          auVar78 = vpunpcklqdq_avx512f(auVar79,auVar77);
                          auVar77 = vpunpckhqdq_avx512f(auVar79,auVar77);
                          in_ZMM8 = vinserti64x4_avx512f(auVar78,auVar77._0_32_,1);
                          auVar77 = vshufi64x2_avx512f(auVar78,auVar77,0xee);
                          auVar78 = vshufi64x2_avx512f(in_ZMM8,auVar77,0x88);
                          auVar79 = vshufi64x2_avx512f(in_ZMM8,auVar77,0xdd);
                          auVar77 = vmovdqu64_avx512f(auVar78);
                          *pauVar28 = auVar77;
                          auVar77 = vmovdqu64_avx512f(auVar79);
                          pauVar28[1] = auVar77;
                          pauVar28 = pauVar28 + 2;
                          uVar42 = uVar42 - 1;
                          iVar15 = iVar15 + 1;
                        } while (uVar42 != 0);
                      }
                    }
                    else {
LAB_001b2666:
                      auVar77 = vpaddd_avx512f(auVar77,auVar78);
                      if (iVar3 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar54) {
                          auVar78 = vpmovsxbd_avx512f(_DAT_005b3ea0);
                          auVar79 = vpmovsxbd_avx512f(_DAT_005b3eb0);
                          iVar15 = 0;
                          do {
                            auVar80 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar80,auVar77);
                            auVar80 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar80,auVar77);
                            auVar80 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data +
                                                          (ulong)(uint)(((iVar21 + iVar15) / iVar57)
                                                                       * iVar14)));
                            auVar81 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data +
                                                          ((long)(iVar21 + iVar15 + 1) %
                                                           (long)iVar57 & 0xffffffffU)));
                            auVar82 = vmovdqa64_avx512f(auVar80);
                            in_ZMM8 = vpermt2d_avx512f(auVar82,auVar78,auVar81);
                            auVar62 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar28 = auVar62;
                            in_ZMM9 = vpermt2d_avx512f(auVar80,auVar79,auVar81);
                            auVar62 = vpmovdb_avx512f(in_ZMM9);
                            *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar62;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                            iVar16 = iVar15 + 2;
                            iVar41 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar41 < (int)uVar54);
                        }
                        uVar42 = uVar54 - iVar16;
                        if (uVar42 != 0 && iVar16 <= (int)uVar54) {
                          do {
                            auVar78 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar78,auVar77);
                            in_ZMM8 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data + (ulong)uVar42))
                            ;
                            auVar62 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar28 = auVar62;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            uVar42 = uVar42 - 1;
                          } while (uVar42 != 0);
                        }
                      }
                      uVar42 = (int)uVar31 >> 3;
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        do {
                          auVar78 = vpbroadcastd_avx512f();
                          auVar78 = vpaddd_avx512f(auVar78,auVar77);
                          auVar78 = vpslld_avx512f(auVar78,3);
                          auVar79 = vpgatherdq_avx512f(*(undefined4 *)
                                                        ((long)bottom_blob->data + (ulong)uVar42));
                          vextracti64x4_avx512f(auVar78,1);
                          auVar78 = vpgatherdq_avx512f(*(undefined4 *)
                                                        ((long)bottom_blob->data + (ulong)uVar42));
                          auVar80 = vpunpcklwd_avx512bw(auVar79,auVar78);
                          auVar78 = vpunpckhwd_avx512bw(auVar79,auVar78);
                          auVar79 = vpunpcklwd_avx512bw(auVar80,auVar78);
                          auVar78 = vpunpckhwd_avx512bw(auVar80,auVar78);
                          auVar80 = vshufi64x2_avx512f(auVar79,auVar78,0x88);
                          auVar78 = vshufi64x2_avx512f(auVar79,auVar78,0xdd);
                          auVar79 = vpunpckldq_avx512f(auVar80,auVar78);
                          auVar78 = vpunpckhdq_avx512f(auVar80,auVar78);
                          auVar80 = vshufi64x2_avx512f(auVar79,auVar78,0x88);
                          auVar78 = vshufi64x2_avx512f(auVar79,auVar78,0xdd);
                          auVar79 = vpunpcklqdq_avx512f(auVar80,auVar78);
                          auVar78 = vpunpckhqdq_avx512f(auVar80,auVar78);
                          in_ZMM8 = vinserti64x4_avx512f(auVar79,auVar78._0_32_,1);
                          auVar78 = vshufi64x2_avx512f(auVar79,auVar78,0xee);
                          in_ZMM9 = vshufi64x2_avx512f(in_ZMM8,auVar78,0x88);
                          auVar79 = vshufi64x2_avx512f(in_ZMM8,auVar78,0xdd);
                          auVar78 = vmovdqu64_avx512f(in_ZMM9);
                          *pauVar28 = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar79);
                          pauVar28[1] = auVar78;
                          pauVar28 = pauVar28 + 2;
                          uVar42 = uVar42 - 1;
                        } while (uVar42 != 0);
                      }
                    }
                    uVar42 = uVar22 + 0x10;
                    iVar16 = uVar22 + 0x1f;
                    uVar22 = uVar42;
                  } while (iVar16 < (int)uVar58);
                }
                if ((int)(uVar42 | 7) < (int)uVar58) {
                  auVar107._4_4_ = uVar55;
                  auVar107._0_4_ = uVar55;
                  auVar107._8_4_ = uVar55;
                  auVar107._12_4_ = uVar55;
                  auVar107._16_4_ = uVar55;
                  auVar107._20_4_ = uVar55;
                  auVar107._24_4_ = uVar55;
                  auVar107._28_4_ = uVar55;
                  auVar68 = vpbroadcastd_avx512vl();
                  auVar72 = vpbroadcastd_avx512vl();
                  iVar39 = uVar29 * dilation_h;
                  uVar31 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar31 = uVar54;
                  }
                  iVar40 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar40 = iVar21;
                  }
                  uVar22 = uVar42;
                  do {
                    auVar76 = _DAT_005b4640;
                    auVar66 = vpbroadcastd_avx512vl();
                    auVar66 = vpaddd_avx2(auVar66,_DAT_005b5320);
                    auVar71 = vpmuludq_avx2(auVar66,auVar73._0_32_);
                    auVar110 = vpsrlq_avx2(auVar71,0x20);
                    auVar71 = vpsrlq_avx2(auVar66,0x20);
                    auVar71 = vpmuludq_avx2(auVar71,auVar73._0_32_);
                    auVar110 = vpblendd_avx2(auVar110,auVar71,0xaa);
                    auVar71 = vpsubd_avx2(auVar66,auVar110);
                    auVar71 = vpsrlvd_avx2(auVar71,auVar107);
                    auVar71 = vpaddd_avx2(auVar71,auVar110);
                    auVar110 = vpsrld_avx2(auVar71,auVar65);
                    auVar71 = vpmulld_avx2(auVar110,auVar68);
                    in_ZMM8 = ZEXT3264(auVar71);
                    auVar66 = vpsubd_avx2(auVar66,auVar71);
                    auVar66 = vpmulld_avx2(auVar66,local_78._0_32_);
                    auVar71 = vpmulld_avx2(auVar110,auVar72);
                    if (stride_w == 1) {
                      auVar62 = vpshufd_avx(auVar71._16_16_,0xff);
                      in_ZMM8 = ZEXT1664(auVar62);
                      uVar17 = vpcmpeqd_avx512vl(auVar71,ZEXT1632(auVar62));
                      if ((uVar17 & 1) == 0) goto LAB_001b2c04;
                      auVar62 = vpaddd_avx(auVar66._0_16_,auVar71._0_16_);
                      iVar16 = auVar62._0_4_;
                      if (iVar3 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar54) {
                          iVar41 = 0;
                          do {
                            uVar17 = (long)(iVar21 + iVar41) % (long)iVar57;
                            iVar15 = iVar21 + iVar41 + 1;
                            uVar25 = (long)iVar15 % (long)iVar57;
                            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff;
                            uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                     uVar25 & 0xffffffff;
                            auVar62._8_8_ = 0;
                            auVar62._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w
                                                  + ((iVar21 + iVar41) / iVar57) * iVar14 + iVar16 +
                                                 (int)((long)uVar17 / (long)kernel_w) * iVar39));
                            auVar63._8_8_ = 0;
                            auVar63._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar25 % (long)kernel_w) * dilation_w
                                                  + (iVar15 / iVar57) * iVar14 + iVar16 +
                                                 (int)((long)uVar25 / (long)kernel_w) * iVar39));
                            auVar62 = vpunpcklbw_avx(auVar62,auVar63);
                            *(undefined1 (*) [16])*pauVar28 = auVar62;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            iVar15 = iVar41 + 2;
                            iVar59 = iVar41 + 3;
                            iVar41 = iVar15;
                          } while (iVar59 < (int)uVar54);
                        }
                        iVar41 = uVar54 - iVar15;
                        if (iVar41 != 0 && iVar15 <= (int)uVar54) {
                          iVar15 = iVar15 + iVar21;
                          do {
                            uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                            *(undefined8 *)*pauVar28 =
                                 *(undefined8 *)
                                  ((long)bottom_blob->data +
                                  (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                         (iVar15 / iVar57) * iVar14 + iVar16 +
                                        (int)((long)uVar17 / (long)kernel_w) * iVar39));
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            iVar15 = iVar15 + 1;
                            iVar41 = iVar41 + -1;
                          } while (iVar41 != 0);
                        }
                      }
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        auVar66 = vpmovsxbw_avx2(_DAT_005b3ec0);
                        in_ZMM9 = ZEXT3264(auVar66);
                        auVar71 = vpmovsxbw_avx2(_DAT_005b3ed0);
                        iVar15 = (int)uVar31 >> 3;
                        iVar41 = iVar40 >> 3;
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar41 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar41 % (long)iVar57 & 0xffffffffU;
                          lVar20 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                          (iVar41 / iVar57) * iVar14 + iVar16 +
                                         (int)((long)uVar17 / (long)kernel_w) * iVar39);
                          auVar110 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar20 * 8);
                          auVar67 = *(undefined1 (*) [32])
                                     ((long)bottom_blob->data + lVar20 * 8 + 0x20);
                          auVar2 = vpunpcklwd_avx2(auVar110,auVar67);
                          auVar110 = vpunpckhwd_avx2(auVar110,auVar67);
                          auVar67 = vpermt2w_avx512vl(auVar2,auVar66,auVar110);
                          auVar110 = vpermt2w_avx512vl(auVar2,auVar71,auVar110);
                          in_ZMM8 = ZEXT3264(auVar110);
                          *(undefined1 (*) [32])*pauVar28 = auVar67;
                          *(undefined1 (*) [32])(*pauVar28 + 0x20) = auVar110;
                          pauVar28 = pauVar28 + 1;
                          iVar41 = iVar41 + 1;
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                    }
                    else {
LAB_001b2c04:
                      auVar66 = vpaddd_avx2(auVar66,auVar71);
                      if (iVar3 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar54) {
                          iVar15 = 0;
                          do {
                            auVar71 = vpbroadcastd_avx512vl();
                            auVar71 = vpaddd_avx2(auVar71,auVar66);
                            auVar110 = vpbroadcastd_avx512vl();
                            vpaddd_avx2(auVar110,auVar66);
                            auVar110 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
                            auVar110 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                  auVar110);
                            auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
                            auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71)
                            ;
                            in_ZMM9 = ZEXT3264(auVar71);
                            auVar75 = vinserti64x4_avx512f(in_ZMM9,auVar71,1);
                            auVar74 = vinserti64x4_avx512f(ZEXT3264(auVar110),auVar110,1);
                            in_ZMM8 = vpermt2ps_avx512f(auVar74,auVar76,auVar75);
                            auVar62 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar28 = auVar62;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                            iVar16 = iVar15 + 2;
                            iVar41 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar41 < (int)uVar54);
                        }
                        iVar15 = uVar54 - iVar16;
                        if (iVar15 != 0 && iVar16 <= (int)uVar54) {
                          do {
                            auVar110 = vpbroadcastd_avx512vl();
                            auVar71 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                            vpaddd_avx2(auVar110,auVar66);
                            auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71)
                            ;
                            in_ZMM9 = ZEXT3264(auVar71);
                            in_ZMM8 = ZEXT3264((undefined1  [32])0x0);
                            auVar62 = vpmovdb_avx512vl(auVar71);
                            *(long *)*pauVar28 = auVar62._0_8_;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                      }
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        auVar71 = vpmovsxbw_avx2(_DAT_005b3ec0);
                        auVar110 = vpmovsxbw_avx2(_DAT_005b3ed0);
                        iVar16 = (int)uVar31 >> 3;
                        do {
                          auVar67 = vpbroadcastd_avx512vl();
                          auVar67 = vpaddd_avx2(auVar67,auVar66);
                          vpslld_avx2(auVar67,3);
                          auVar67 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                          auVar111 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar67);
                          auVar67 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                          auVar67 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar67);
                          auVar2 = vpunpcklwd_avx2(auVar111,auVar67);
                          auVar67 = vpunpckhwd_avx2(auVar111,auVar67);
                          in_ZMM8 = ZEXT3264(auVar67);
                          auVar111 = vpermt2w_avx512vl(auVar2,auVar71,auVar67);
                          in_ZMM9 = ZEXT3264(auVar111);
                          auVar67 = vpermt2w_avx512vl(auVar2,auVar110,auVar67);
                          *(undefined1 (*) [32])*pauVar28 = auVar111;
                          *(undefined1 (*) [32])(*pauVar28 + 0x20) = auVar67;
                          pauVar28 = pauVar28 + 1;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                    }
                    uVar42 = uVar22 + 8;
                    iVar16 = uVar22 + 0xf;
                    uVar22 = uVar42;
                  } while (iVar16 < (int)uVar58);
                }
                if ((int)(uVar42 | 3) < (int)uVar58) {
                  auVar106._4_4_ = uVar55;
                  auVar106._0_4_ = uVar55;
                  auVar106._8_4_ = uVar55;
                  auVar106._12_4_ = uVar55;
                  auVar62 = vpbroadcastd_avx512vl();
                  auVar63 = vpbroadcastd_avx512vl();
                  iVar39 = uVar29 * dilation_h;
                  uVar55 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar55 = uVar54;
                  }
                  iVar40 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar40 = iVar21;
                  }
                  uVar31 = uVar42;
                  do {
                    auVar64 = vpbroadcastd_avx512vl();
                    auVar64 = vpaddd_avx(auVar64,_DAT_005b3950);
                    auVar109 = vpmuludq_avx(auVar64,auVar73._0_16_);
                    auVar108 = vpsrlq_avx(auVar109,0x20);
                    auVar109 = vpsrlq_avx(auVar64,0x20);
                    auVar109 = vpmuludq_avx(auVar109,auVar73._0_16_);
                    auVar108 = vpblendd_avx2(auVar108,auVar109,10);
                    auVar109 = vpsubd_avx(auVar64,auVar108);
                    auVar109 = vpsrlvd_avx2(auVar109,auVar106);
                    auVar109 = vpaddd_avx(auVar109,auVar108);
                    auVar108 = vpsrld_avx(auVar109,auVar65);
                    auVar109 = vpmulld_avx(auVar108,auVar62);
                    auVar76 = ZEXT1664(auVar109);
                    auVar64 = vpsubd_avx(auVar64,auVar109);
                    auVar64 = vpmulld_avx(auVar64,local_78._0_16_);
                    auVar109 = vpmulld_avx(auVar108,auVar63);
                    auVar64 = vpaddd_avx(auVar64,auVar109);
                    if ((stride_w == 1) && (auVar109._0_4_ == auVar109._12_4_)) {
                      iVar16 = auVar64._0_4_;
                      if (iVar3 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar54) {
                          iVar41 = 0;
                          do {
                            uVar17 = (long)(iVar21 + iVar41) % (long)iVar57;
                            iVar15 = iVar21 + iVar41 + 1;
                            uVar25 = (long)iVar15 % (long)iVar57;
                            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff;
                            uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                     uVar25 & 0xffffffff;
                            auVar64._8_8_ = 0;
                            auVar64._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w
                                                  + ((iVar21 + iVar41) / iVar57) * iVar14 + iVar16 +
                                                 (int)((long)uVar17 / (long)kernel_w) * iVar39));
                            auVar109._8_8_ = 0;
                            auVar109._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar25 % (long)kernel_w) * dilation_w
                                                  + (iVar15 / iVar57) * iVar14 + iVar16 +
                                                 (int)((long)uVar25 / (long)kernel_w) * iVar39));
                            auVar64 = vpunpcklbw_avx(auVar64,auVar109);
                            *(long *)*pauVar28 = auVar64._0_8_;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            iVar15 = iVar41 + 2;
                            iVar59 = iVar41 + 3;
                            iVar41 = iVar15;
                          } while (iVar59 < (int)uVar54);
                        }
                        iVar41 = uVar54 - iVar15;
                        if (iVar41 != 0 && iVar15 <= (int)uVar54) {
                          iVar15 = iVar15 + iVar21;
                          do {
                            uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                            lVar20 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar57) * iVar14 + iVar16 +
                                           (int)((long)uVar17 / (long)kernel_w) * iVar39);
                            (*pauVar28)[0] = *(undefined1 *)((long)bottom_blob->data + lVar20);
                            (*pauVar28)[1] = *(undefined1 *)((long)bottom_blob->data + lVar20 + 1);
                            (*pauVar28)[2] = *(undefined1 *)((long)bottom_blob->data + lVar20 + 2);
                            (*pauVar28)[3] = *(undefined1 *)((long)bottom_blob->data + lVar20 + 3);
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            iVar15 = iVar15 + 1;
                            iVar41 = iVar41 + -1;
                          } while (iVar41 != 0);
                        }
                      }
                      iVar15 = (int)uVar55 >> 3;
                      iVar41 = iVar40 >> 3;
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar41 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar41 % (long)iVar57 & 0xffffffffU;
                          lVar20 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                          (iVar41 / iVar57) * iVar14 + iVar16 +
                                         (int)((long)uVar17 / (long)kernel_w) * iVar39);
                          auVar64 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar20 * 8);
                          auVar109 = *(undefined1 (*) [16])
                                      ((long)bottom_blob->data + lVar20 * 8 + 0x10);
                          auVar108 = vpunpcklwd_avx(auVar64,auVar109);
                          auVar64 = vpunpckhwd_avx(auVar64,auVar109);
                          auVar109 = vpunpcklwd_avx(auVar108,auVar64);
                          auVar64 = vpunpckhwd_avx(auVar108,auVar64);
                          *(undefined1 (*) [16])*pauVar28 = auVar109;
                          *(undefined1 (*) [16])(*pauVar28 + 0x10) = auVar64;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                          iVar15 = iVar15 + -1;
                          iVar41 = iVar41 + 1;
                        } while (iVar15 != 0);
                      }
                    }
                    else {
                      if (iVar3 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar54) {
                          auVar68 = vpmovsxbd_avx2(ZEXT816(0xb030a0209010800));
                          iVar15 = 0;
                          do {
                            auVar109 = vpbroadcastd_avx512vl();
                            auVar109 = vpaddd_avx(auVar109,auVar64);
                            auVar108 = vpbroadcastd_avx512vl();
                            auVar108 = vpaddd_avx(auVar108,auVar64);
                            auVar76 = ZEXT1664(auVar108);
                            auVar108 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
                            auVar108 = vpgatherdd((undefined1  [16])0x0,auVar108);
                            auVar109 = vpcmpeqd_avx(auVar109,auVar109);
                            auVar109 = vpgatherdd((undefined1  [16])0x0,auVar109);
                            in_ZMM8 = ZEXT1664(auVar109);
                            auVar72 = vpermt2d_avx512vl(ZEXT1632(auVar108),auVar68,
                                                        ZEXT1632(auVar109));
                            in_ZMM9 = ZEXT3264(auVar72);
                            auVar109 = vpmovdb_avx512vl(auVar72);
                            *(long *)*pauVar28 = auVar109._0_8_;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                            iVar16 = iVar15 + 2;
                            iVar41 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar41 < (int)uVar54);
                        }
                        iVar15 = uVar54 - iVar16;
                        if (iVar15 != 0 && iVar16 <= (int)uVar54) {
                          do {
                            auVar108 = vpbroadcastd_avx512vl();
                            auVar109 = vpcmpeqd_avx(auVar76._0_16_,auVar76._0_16_);
                            vpaddd_avx(auVar108,auVar64);
                            auVar109 = vpgatherdd((undefined1  [16])0x0,auVar109);
                            in_ZMM8 = ZEXT1664(auVar109);
                            auVar76 = ZEXT1664((undefined1  [16])0x0);
                            auVar109 = vpmovdb_avx512vl(auVar109);
                            *(int *)*pauVar28 = auVar109._0_4_;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                      }
                      iVar16 = (int)uVar55 >> 3;
                      if (7 < (int)uVar54 && iVar3 == 8) {
                        do {
                          auVar109 = vpbroadcastd_avx512vl();
                          auVar109 = vpaddd_avx(auVar109,auVar64);
                          vpslld_avx(auVar109,3);
                          auVar68 = vpcmpeqd_avx2(auVar76._0_32_,auVar76._0_32_);
                          auVar72 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar68);
                          in_ZMM8 = ZEXT3264(auVar72);
                          auVar76 = ZEXT3264((undefined1  [32])0x0);
                          auVar68 = vpmovsxbw_avx2(_DAT_005b3ee0);
                          auVar68 = vpermw_avx512vl(auVar68,auVar72);
                          *(undefined1 (*) [32])*pauVar28 = auVar68;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                    }
                    uVar42 = uVar31 + 4;
                    iVar16 = uVar31 + 7;
                    uVar31 = uVar42;
                  } while (iVar16 < (int)uVar58);
                }
                if ((int)(uVar42 | 1) < (int)uVar58) {
                  iVar39 = uVar29 * dilation_h;
                  uVar55 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar55 = uVar54;
                  }
                  iVar16 = (int)uVar55 >> 3;
                  iVar40 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar40 = iVar21;
                  }
                  local_240 = CONCAT71(local_240._1_7_,(int)uVar54 < 8 || iVar3 != 8);
                  uVar55 = uVar42;
                  do {
                    iVar15 = uVar55 + iVar47 + 1;
                    iVar43 = ((int)(uVar55 + iVar47) / iVar30) * uVar29 * stride_h;
                    iVar41 = (iVar15 / iVar30) * uVar29 * stride_h;
                    iVar59 = ((int)(uVar55 + iVar47) % iVar30) * stride_w + iVar43;
                    if ((stride_w == 1) && (iVar43 == iVar41)) {
                      if (iVar3 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar54) {
                          iVar41 = 0;
                          do {
                            uVar17 = (long)(iVar21 + iVar41) % (long)iVar57;
                            iVar15 = iVar21 + iVar41 + 1;
                            uVar25 = (long)iVar15 % (long)iVar57;
                            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff;
                            uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                     uVar25 & 0xffffffff;
                            pvVar7 = bottom_blob->data;
                            lVar52 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                            ((iVar21 + iVar41) / iVar57) * iVar14 + iVar59 +
                                           (int)((long)uVar17 / (long)kernel_w) * iVar39);
                            lVar20 = (long)((int)((long)uVar25 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar57) * iVar14 + iVar59 +
                                           (int)((long)uVar25 / (long)kernel_w) * iVar39);
                            (*pauVar28)[0] = *(undefined1 *)((long)pvVar7 + lVar52);
                            (*pauVar28)[1] = *(undefined1 *)((long)pvVar7 + lVar20);
                            (*pauVar28)[2] = *(undefined1 *)((long)pvVar7 + lVar52 + 1);
                            (*pauVar28)[3] = *(undefined1 *)((long)pvVar7 + lVar20 + 1);
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            iVar15 = iVar41 + 2;
                            iVar43 = iVar41 + 3;
                            iVar41 = iVar15;
                          } while (iVar43 < (int)uVar54);
                        }
                        iVar41 = uVar54 - iVar15;
                        if (iVar41 != 0 && iVar15 <= (int)uVar54) {
                          iVar15 = iVar15 + iVar21;
                          do {
                            uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                            pvVar7 = bottom_blob->data;
                            lVar20 = (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar57) * iVar14 + iVar59 +
                                           (int)((long)uVar17 / (long)kernel_w) * iVar39);
                            (*pauVar28)[0] = *(undefined1 *)((long)pvVar7 + lVar20);
                            (*pauVar28)[1] = *(undefined1 *)((long)pvVar7 + lVar20 + 1);
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 2);
                            iVar15 = iVar15 + 1;
                            iVar41 = iVar41 + -1;
                          } while (iVar41 != 0);
                        }
                      }
                      iVar15 = iVar40 >> 3;
                      iVar41 = iVar16;
                      if ((int)uVar54 >= 8 && iVar3 == 8) {
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                          auVar65 = vpshufb_avx(*(undefined1 (*) [16])
                                                 ((long)bottom_blob->data +
                                                 (long)((int)((long)uVar17 % (long)kernel_w) *
                                                        dilation_w +
                                                        (iVar15 / iVar57) * iVar14 + iVar59 +
                                                       (int)((long)uVar17 / (long)kernel_w) * iVar39
                                                       ) * 8),_DAT_005b3e90);
                          *(undefined1 (*) [16])*pauVar28 = auVar65;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                          iVar41 = iVar41 + -1;
                          iVar15 = iVar15 + 1;
                        } while (iVar41 != 0);
                      }
                    }
                    else {
                      iVar41 = (iVar15 % iVar30) * stride_w + iVar41;
                      uVar42 = 0;
                      if (iVar3 == 1) {
                        uVar42 = 0;
                        if (1 < (int)uVar54) {
                          uVar31 = 0;
                          do {
                            uVar17 = (long)(int)(iVar21 + uVar31) % (long)iVar57;
                            iVar15 = iVar21 + uVar31 + 1;
                            uVar25 = (long)iVar15 % (long)iVar57;
                            uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                     uVar17 & 0xffffffff;
                            iVar43 = (int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                     ((int)(iVar21 + uVar31) / iVar57) * iVar14 +
                                     (int)((long)uVar17 / (long)kernel_w) * iVar39;
                            uVar17 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                     uVar25 & 0xffffffff;
                            iVar15 = (int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                     (iVar15 / iVar57) * iVar14 +
                                     (int)((long)uVar17 / (long)kernel_w) * iVar39;
                            pvVar7 = bottom_blob->data;
                            (*pauVar28)[0] = *(undefined1 *)((long)pvVar7 + (long)(iVar43 + iVar59))
                            ;
                            (*pauVar28)[1] = *(undefined1 *)((long)pvVar7 + (long)(iVar15 + iVar59))
                            ;
                            (*pauVar28)[2] = *(undefined1 *)((long)pvVar7 + (long)(iVar43 + iVar41))
                            ;
                            (*pauVar28)[3] = *(undefined1 *)((long)pvVar7 + (long)(iVar15 + iVar41))
                            ;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                            uVar42 = uVar31 + 2;
                            iVar15 = uVar31 + 3;
                            uVar31 = uVar42;
                          } while (iVar15 < (int)uVar54);
                        }
                        iVar15 = uVar54 - uVar42;
                        if (iVar15 != 0 && (int)uVar42 <= (int)uVar54) {
                          iVar43 = uVar42 + iVar21;
                          do {
                            uVar17 = (ulong)(uint)((int)((long)iVar43 % (long)iVar57) >> 0x1f) <<
                                     0x20 | (long)iVar43 % (long)iVar57 & 0xffffffffU;
                            iVar26 = (int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                     (iVar43 / iVar57) * iVar14 +
                                     (int)((long)uVar17 / (long)kernel_w) * iVar39;
                            pvVar7 = bottom_blob->data;
                            (*pauVar28)[0] = *(undefined1 *)((long)pvVar7 + (long)(iVar26 + iVar59))
                            ;
                            (*pauVar28)[1] = *(undefined1 *)((long)pvVar7 + (long)(iVar26 + iVar41))
                            ;
                            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 2);
                            iVar43 = iVar43 + 1;
                            iVar15 = iVar15 + -1;
                            uVar42 = uVar54;
                          } while (iVar15 != 0);
                        }
                      }
                      if ((iVar3 == 8) &&
                         (iVar15 = iVar16 - uVar42, iVar15 != 0 && (int)uVar42 <= iVar16)) {
                        iVar43 = uVar42 + (iVar40 >> 3);
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar43 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar43 % (long)iVar57 & 0xffffffffU;
                          iVar26 = (int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                   (iVar43 / iVar57) * iVar14 +
                                   (int)((long)uVar17 / (long)kernel_w) * iVar39;
                          auVar65._8_8_ = 0;
                          auVar65._0_8_ =
                               *(ulong *)((long)bottom_blob->data + (long)(iVar26 + iVar59) * 8);
                          auVar108._8_8_ = 0;
                          auVar108._0_8_ =
                               *(ulong *)((long)bottom_blob->data + (long)(iVar26 + iVar41) * 8);
                          auVar65 = vpunpcklwd_avx(auVar65,auVar108);
                          *(undefined1 (*) [16])*pauVar28 = auVar65;
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                          iVar43 = iVar43 + 1;
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                    }
                    uVar42 = uVar55 + 2;
                    iVar15 = uVar55 + 3;
                    uVar55 = uVar42;
                  } while (iVar15 < (int)uVar58);
                }
                if ((int)uVar42 < (int)uVar58) {
                  iVar39 = uVar29 * dilation_h;
                  uVar55 = uVar54 + 7;
                  if (-1 < (int)uVar54) {
                    uVar55 = uVar54;
                  }
                  iVar40 = iVar21 + 7;
                  if (-1 < iVar21) {
                    iVar40 = iVar21;
                  }
                  do {
                    iVar16 = ((int)(iVar47 + uVar42) / iVar30) * uVar29 * stride_h +
                             ((int)(iVar47 + uVar42) % iVar30) * stride_w;
                    if (iVar3 == 1) {
                      lVar20 = 0;
                      if (1 < (int)uVar54) {
                        lVar20 = 0;
                        do {
                          iVar15 = (int)lVar20;
                          uVar17 = (long)(iVar21 + iVar15) % (long)iVar57;
                          iVar41 = iVar21 + iVar15 + 1;
                          uVar25 = (long)iVar41 % (long)iVar57;
                          uVar17 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
                          uVar25 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
                          pvVar7 = bottom_blob->data;
                          (*pauVar28)[lVar20] =
                               *(undefined1 *)
                                ((long)pvVar7 +
                                (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                       ((iVar21 + iVar15) / iVar57) * iVar14 + iVar16 +
                                      (int)((long)uVar17 / (long)kernel_w) * iVar39));
                          (*pauVar28)[lVar20 + 1] =
                               *(undefined1 *)
                                ((long)pvVar7 +
                                (long)((int)((long)uVar25 % (long)kernel_w) * dilation_w +
                                       (iVar41 / iVar57) * iVar14 + iVar16 +
                                      (int)((long)uVar25 / (long)kernel_w) * iVar39));
                          lVar20 = lVar20 + 2;
                        } while (iVar15 + 3 < (int)uVar54);
                        pauVar28 = (undefined1 (*) [64])(*pauVar28 + lVar20);
                      }
                      iVar15 = (int)lVar20;
                      iVar41 = uVar54 - iVar15;
                      if (iVar41 != 0 && iVar15 <= (int)uVar54) {
                        iVar15 = iVar15 + iVar21;
                        do {
                          uVar17 = (ulong)(uint)((int)((long)iVar15 % (long)iVar57) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar57 & 0xffffffffU;
                          (*pauVar28)[0] =
                               *(undefined1 *)
                                ((long)bottom_blob->data +
                                (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                       (iVar15 / iVar57) * iVar14 + iVar16 +
                                      (int)((long)uVar17 / (long)kernel_w) * iVar39));
                          pauVar28 = (undefined1 (*) [64])(*pauVar28 + 1);
                          iVar15 = iVar15 + 1;
                          iVar41 = iVar41 + -1;
                        } while (iVar41 != 0);
                      }
                    }
                    iVar15 = (int)uVar55 >> 3;
                    iVar41 = iVar40 >> 3;
                    if (7 < (int)uVar54 && iVar3 == 8) {
                      do {
                        uVar17 = (ulong)(uint)((int)((long)iVar41 % (long)iVar57) >> 0x1f) << 0x20 |
                                 (long)iVar41 % (long)iVar57 & 0xffffffffU;
                        *(undefined8 *)*pauVar28 =
                             *(undefined8 *)
                              ((long)bottom_blob->data +
                              (long)((int)((long)uVar17 % (long)kernel_w) * dilation_w +
                                     (iVar41 / iVar57) * iVar14 + iVar16 +
                                    (int)((long)uVar17 / (long)kernel_w) * iVar39) * 8);
                        pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                        iVar15 = iVar15 + -1;
                        iVar41 = iVar41 + 1;
                      } while (iVar15 != 0);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar58);
                }
              }
            }
            else {
              convolution_im2col_input_tile_int8_avxvnni
                        (bottom_blob,&local_228,iVar47,uVar58,iVar21,uVar54,kernel_w,(int)local_250,
                         dilation_w,dilation_h,stride_w,stride_h);
            }
          }
          else {
            convolution_im2col_input_tile_int8_avxvnniint8
                      (bottom_blob,&local_228,iVar47,uVar58,iVar21,uVar54,kernel_w,(int)local_250,
                       dilation_w,dilation_h,stride_w,stride_h);
          }
        }
        else {
          convolution_im2col_input_tile_int8_avx512vnni
                    (bottom_blob,&local_228,iVar47,uVar58,iVar21,uVar54,kernel_w,(int)local_250,
                     dilation_w,dilation_h,stride_w,stride_h);
        }
        piVar13 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if ((undefined1 (*) [64])local_228.data != (undefined1 (*) [64])0x0) {
                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                free(local_228.data);
              }
            }
            else {
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        uVar58 = (int)local_258 + 1;
        uVar17 = (ulong)uVar58;
        iVar14 = TILE_N;
        iVar47 = TILE_M;
      } while (uVar58 != uVar53);
    }
    uVar17 = local_238;
    local_228.cstep = 0;
    local_228.data = (void *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,iVar47 * iVar14,1,nT,4,opt->workspace_allocator);
    iVar44 = -100;
    if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
      if (0 < local_22c) {
        iVar14 = 0;
        uVar25 = local_1e0;
        do {
          local_26c = TILE_M * iVar14;
          uVar53 = M - local_26c;
          if (TILE_M < M - local_26c) {
            uVar53 = TILE_M;
          }
          iVar47 = get_omp_thread_num();
          m.data = (void *)((long)iVar47 * local_228.cstep * local_228.elemsize +
                           (long)local_228.data);
          m.refcount = (int *)0x0;
          m.elemsize = local_228.elemsize;
          m.elempack = local_228.elempack;
          m.allocator = local_228.allocator;
          m.w = local_228.w;
          m.h = local_228.h;
          m.d = 1;
          m.c = local_228.d;
          m.dims = local_228.dims + -1;
          m.cstep = (local_228.elemsize * (long)local_228.h * (long)local_228.w + 0xf &
                    0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            m.cstep = (long)local_228.h * (long)local_228.w;
          }
          auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
          auVar73 = vpmovsxbd_avx512f(_DAT_005b3f00);
          auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
          auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
          if (0 < (int)uVar25) {
            local_258 = (ulong)local_26c;
            local_78._0_8_ = (long)(int)uVar53;
            iVar47 = 0;
            do {
              uVar58 = (int)uVar25 - iVar47;
              if (TILE_N < (int)uVar58) {
                uVar58 = TILE_N;
              }
              iVar44 = (int)uVar17;
              if (0 < iVar44) {
                iVar21 = 0;
                do {
                  iVar57 = iVar44 - iVar21;
                  if (TILE_K < iVar44 - iVar21) {
                    iVar57 = TILE_K;
                  }
                  local_c0.w = AT->w;
                  local_c0.cstep = (size_t)local_c0.w;
                  local_c0.elemsize = AT->elemsize;
                  local_c0.elempack = AT->elempack;
                  local_c0.allocator = AT->allocator;
                  local_c0.data =
                       (void *)((long)AT->data +
                               local_c0.elemsize * local_c0.cstep * (long)(iVar21 / TILE_K) +
                               (long)(local_26c / TILE_M) * AT->cstep * local_c0.elemsize);
                  local_c0.refcount = (int *)0x0;
                  local_c0.dims = 2;
                  local_c0.h = 1;
                  local_c0.d = 1;
                  local_c0.c = 1;
                  local_108.cstep = (size_t)local_1c8.w;
                  local_108.data =
                       (void *)((long)local_1c8.data +
                               local_1c8.elemsize * local_108.cstep * (long)(iVar21 / TILE_K) +
                               (long)(iVar47 / TILE_N) * local_1c8.cstep * local_1c8.elemsize);
                  local_108.refcount = (int *)0x0;
                  local_108.elemsize = local_1c8.elemsize;
                  local_108.elempack = local_1c8.elempack;
                  local_108.allocator = local_1c8.allocator;
                  local_108.dims = 2;
                  local_108.w = local_1c8.w;
                  local_108.h = 1;
                  local_108.d = 1;
                  local_108.c = 1;
                  Gemm_x86_avx512_utility::gemm_transB_packed_tile_int8
                            (&local_c0,&local_108,&m,local_26c,uVar53,iVar47,uVar58,iVar21,iVar57);
                  auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
                  auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                  auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                  if (local_108.refcount != (int *)0x0) {
                    LOCK();
                    *local_108.refcount = *local_108.refcount + -1;
                    UNLOCK();
                    if (*local_108.refcount == 0) {
                      if (local_108.allocator == (Allocator *)0x0) {
                        if (local_108.data != (void *)0x0) {
                          free(local_108.data);
                          auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                          auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                          auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
                        }
                      }
                      else {
                        (*(local_108.allocator)->_vptr_Allocator[3])();
                        auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                        auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                        auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
                      }
                    }
                  }
                  auVar73 = vpmovsxbd_avx512f(_DAT_005b3f00);
                  if (local_c0.refcount != (int *)0x0) {
                    LOCK();
                    *local_c0.refcount = *local_c0.refcount + -1;
                    UNLOCK();
                    if (*local_c0.refcount == 0) {
                      if (local_c0.allocator == (Allocator *)0x0) {
                        if (local_c0.data != (void *)0x0) {
                          free(local_c0.data);
                          auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                          auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                          auVar73 = vpmovsxbd_avx512f(_DAT_005b3f00);
                          auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
                        }
                      }
                      else {
                        (*(local_c0.allocator)->_vptr_Allocator[3])();
                        auVar76 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                        auVar75 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                        auVar73 = vpmovsxbd_avx512f(_DAT_005b3f00);
                        auVar74 = vpmovsxbd_avx512f(_DAT_005b3ef0);
                      }
                    }
                  }
                  iVar21 = iVar21 + TILE_K;
                } while (iVar21 < iVar44);
              }
              uVar25 = local_1e0;
              lVar20 = 0;
              iVar44 = local_248->elempack;
              sVar6 = local_248->cstep;
              iVar21 = (int)sVar6;
              pauVar28 = (undefined1 (*) [64])m.data;
              if (0xf < (int)uVar53) {
                local_250 = (long)(iVar44 * iVar47);
                lVar18 = (long)(iVar21 * 2);
                lVar32 = (long)(sVar6 * 0x300000000) >> 0x20;
                lVar50 = (long)(iVar21 * 4);
                lVar33 = (long)(sVar6 * 0x500000000) >> 0x20;
                lVar34 = (long)(sVar6 * 0x600000000) >> 0x20;
                lVar35 = (long)(sVar6 * 0x700000000) >> 0x20;
                lVar19 = (long)(iVar21 * 8);
                lVar36 = (long)((sVar6 << 0x20) * 9) >> 0x20;
                lVar37 = (long)((sVar6 << 0x21) * 5) >> 0x20;
                lVar45 = (long)(sVar6 * 0xb00000000) >> 0x20;
                lVar60 = (long)((sVar6 << 0x22) * 3) >> 0x20;
                lVar56 = (long)(sVar6 * 0xd00000000) >> 0x20;
                lVar46 = (long)(sVar6 * 0xe00000000) >> 0x20;
                lVar48 = (long)(sVar6 * 0xf00000000) >> 0x20;
                auVar77 = vpbroadcastd_avx512f();
                auVar77 = vpmulld_avx512f(auVar77,_DAT_005b4580);
                lVar51 = (long)iVar21;
                lVar52 = 0;
                do {
                  pauVar49 = (undefined1 (*) [64])
                             ((long)local_248->data +
                             local_250 * 4 + (local_258 + lVar52) * lVar51 * 4);
                  uVar54 = 0;
                  if (0xf < (int)uVar58) {
                    iVar57 = 0xf;
                    do {
                      pauVar27 = pauVar28;
                      auVar78 = vmovdqa64_avx512f(*pauVar27);
                      auVar79 = vmovdqa64_avx512f(pauVar27[2]);
                      auVar80 = vmovdqa64_avx512f(pauVar27[4]);
                      auVar81 = vmovdqa64_avx512f(pauVar27[6]);
                      auVar82 = vmovdqa64_avx512f(pauVar27[8]);
                      auVar83 = vmovdqa64_avx512f(pauVar27[10]);
                      auVar84 = vmovdqa64_avx512f(pauVar27[0xc]);
                      auVar85 = vpshufd_avx512f(pauVar27[1],0x93);
                      auVar86 = vpshufd_avx512f(pauVar27[3],0x93);
                      auVar87 = vpshufd_avx512f(pauVar27[5],0x93);
                      auVar88 = vpshufd_avx512f(pauVar27[7],0x93);
                      auVar89 = vpshufd_avx512f(pauVar27[9],0x93);
                      auVar90 = vpshufd_avx512f(pauVar27[0xb],0x93);
                      auVar91 = vpshufd_avx512f(pauVar27[0xd],0x93);
                      auVar92 = vmovdqa64_avx512f(pauVar27[0xe]);
                      auVar93 = vpshufd_avx512f(pauVar27[0xf],0x93);
                      auVar94 = vpunpckldq_avx512f(auVar78,auVar86);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar86);
                      auVar86 = vpunpckldq_avx512f(auVar79,auVar85);
                      auVar79 = vpunpckhdq_avx512f(auVar79,auVar85);
                      auVar85 = vpunpckldq_avx512f(auVar80,auVar88);
                      auVar80 = vpunpckhdq_avx512f(auVar80,auVar88);
                      auVar88 = vpunpckldq_avx512f(auVar81,auVar87);
                      auVar81 = vpunpckhdq_avx512f(auVar81,auVar87);
                      auVar87 = vpunpckldq_avx512f(auVar82,auVar90);
                      auVar82 = vpunpckhdq_avx512f(auVar82,auVar90);
                      auVar90 = vpunpckldq_avx512f(auVar83,auVar89);
                      auVar83 = vpunpckhdq_avx512f(auVar83,auVar89);
                      auVar89 = vpunpckldq_avx512f(auVar84,auVar93);
                      auVar84 = vpunpckhdq_avx512f(auVar84,auVar93);
                      auVar93 = vpunpckldq_avx512f(auVar92,auVar91);
                      auVar91 = vpunpckhdq_avx512f(auVar92,auVar91);
                      auVar92 = vpunpcklqdq_avx512f(auVar94,auVar86);
                      auVar95 = vpunpcklqdq_avx512f(auVar79,auVar78);
                      auVar96 = vpunpcklqdq_avx512f(auVar85,auVar88);
                      auVar97 = vpunpcklqdq_avx512f(auVar81,auVar80);
                      auVar98 = vpunpcklqdq_avx512f(auVar87,auVar90);
                      auVar99 = vpunpcklqdq_avx512f(auVar83,auVar82);
                      auVar100 = vpunpcklqdq_avx512f(auVar89,auVar93);
                      auVar101 = vpunpcklqdq_avx512f(auVar91,auVar84);
                      auVar86 = vpermt2d_avx512f(auVar86,auVar74,auVar94);
                      auVar78 = vpermt2d_avx512f(auVar78,auVar74,auVar79);
                      auVar79 = vpermt2d_avx512f(auVar88,auVar74,auVar85);
                      auVar80 = vpermt2d_avx512f(auVar80,auVar74,auVar81);
                      auVar81 = vpermt2d_avx512f(auVar90,auVar74,auVar87);
                      auVar82 = vpermt2d_avx512f(auVar82,auVar74,auVar83);
                      auVar83 = vpermt2d_avx512f(auVar93,auVar74,auVar89);
                      auVar84 = vpermt2d_avx512f(auVar84,auVar74,auVar91);
                      auVar85 = vshufi64x2_avx512f(auVar92,auVar98,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar86,auVar81,0x88);
                      auVar88 = vshufi64x2_avx512f(auVar95,auVar99,0x88);
                      auVar89 = vshufi64x2_avx512f(auVar78,auVar82,0x88);
                      auVar90 = vshufi64x2_avx512f(auVar98,auVar92,0xdd);
                      auVar81 = vshufi64x2_avx512f(auVar81,auVar86,0xdd);
                      auVar86 = vshufi64x2_avx512f(auVar99,auVar95,0xdd);
                      auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0xdd);
                      auVar82 = vshufi64x2_avx512f(auVar96,auVar100,0x88);
                      auVar91 = vshufi64x2_avx512f(auVar79,auVar83,0x88);
                      auVar92 = vshufi64x2_avx512f(auVar97,auVar101,0x88);
                      auVar93 = vshufi64x2_avx512f(auVar80,auVar84,0x88);
                      auVar94 = vshufi64x2_avx512f(auVar100,auVar96,0xdd);
                      auVar79 = vshufi64x2_avx512f(auVar83,auVar79,0xdd);
                      auVar83 = vshufi64x2_avx512f(auVar101,auVar97,0xdd);
                      auVar80 = vshufi64x2_avx512f(auVar84,auVar80,0xdd);
                      auVar84 = vshufi64x2_avx512f(auVar85,auVar82,0xd8);
                      auVar95 = vshufi64x2_avx512f(auVar87,auVar91,0xd8);
                      auVar96 = vshufi64x2_avx512f(auVar88,auVar92,0xd8);
                      auVar97 = vshufi64x2_avx512f(auVar89,auVar93,0xd8);
                      auVar98 = vshufi64x2_avx512f(auVar90,auVar94,0xd8);
                      auVar99 = vshufi64x2_avx512f(auVar81,auVar79,0xd8);
                      auVar100 = vshufi64x2_avx512f(auVar86,auVar83,0xd8);
                      auVar101 = vshufi64x2_avx512f(auVar78,auVar80,0xd8);
                      auVar82 = vshufi64x2_avx512f(auVar82,auVar85,0xd8);
                      auVar85 = vshufi64x2_avx512f(auVar91,auVar87,0xd8);
                      auVar87 = vshufi64x2_avx512f(auVar92,auVar88,0xd8);
                      auVar88 = vshufi64x2_avx512f(auVar93,auVar89,0xd8);
                      auVar89 = vshufi64x2_avx512f(auVar94,auVar90,0xd8);
                      auVar79 = vshufi64x2_avx512f(auVar79,auVar81,0xd8);
                      auVar81 = vshufi64x2_avx512f(auVar83,auVar86,0xd8);
                      auVar78 = vshufi64x2_avx512f(auVar80,auVar78,0xd8);
                      if (iVar44 < 8) {
                        if (iVar44 == 1) {
                          auVar80 = vpunpckldq_avx512f(auVar84,auVar95);
                          auVar83 = vpunpckhdq_avx512f(auVar84,auVar95);
                          auVar84 = vpunpckldq_avx512f(auVar96,auVar97);
                          auVar86 = vpunpckhdq_avx512f(auVar96,auVar97);
                          auVar90 = vpunpckldq_avx512f(auVar98,auVar99);
                          auVar91 = vpunpckhdq_avx512f(auVar98,auVar99);
                          auVar92 = vpunpckldq_avx512f(auVar100,auVar101);
                          auVar93 = vpunpckhdq_avx512f(auVar100,auVar101);
                          auVar94 = vpunpckldq_avx512f(auVar82,auVar85);
                          auVar82 = vpunpckhdq_avx512f(auVar82,auVar85);
                          auVar85 = vpunpckldq_avx512f(auVar87,auVar88);
                          auVar87 = vpunpckhdq_avx512f(auVar87,auVar88);
                          auVar88 = vpunpckldq_avx512f(auVar89,auVar79);
                          auVar79 = vpunpckhdq_avx512f(auVar89,auVar79);
                          auVar89 = vpunpckldq_avx512f(auVar81,auVar78);
                          auVar78 = vpunpckhdq_avx512f(auVar81,auVar78);
                          auVar81 = vpunpckhqdq_avx512f(auVar80,auVar84);
                          auVar95 = vpunpckhqdq_avx512f(auVar83,auVar86);
                          auVar96 = vpunpckhqdq_avx512f(auVar90,auVar92);
                          auVar97 = vpunpckhqdq_avx512f(auVar91,auVar93);
                          auVar98 = vpunpckhqdq_avx512f(auVar94,auVar85);
                          auVar99 = vpunpckhqdq_avx512f(auVar82,auVar87);
                          auVar100 = vpunpckhqdq_avx512f(auVar88,auVar89);
                          auVar101 = vpunpckhqdq_avx512f(auVar79,auVar78);
                          auVar80 = vpunpcklqdq_avx512f(auVar80,auVar84);
                          auVar84 = vpunpcklqdq_avx512f(auVar90,auVar92);
                          auVar90 = vshufi64x2_avx512f(auVar80,auVar84,0x88);
                          auVar85 = vpunpcklqdq_avx512f(auVar94,auVar85);
                          auVar88 = vpunpcklqdq_avx512f(auVar88,auVar89);
                          auVar89 = vshufi64x2_avx512f(auVar85,auVar88,0x88);
                          auVar92 = vshufi64x2_avx512f(auVar81,auVar96,0x88);
                          auVar94 = vshufi64x2_avx512f(auVar98,auVar100,0x88);
                          auVar83 = vpunpcklqdq_avx512f(auVar83,auVar86);
                          auVar86 = vpunpcklqdq_avx512f(auVar91,auVar93);
                          auVar91 = vshufi64x2_avx512f(auVar83,auVar86,0x88);
                          auVar82 = vpunpcklqdq_avx512f(auVar82,auVar87);
                          auVar78 = vpunpcklqdq_avx512f(auVar79,auVar78);
                          auVar79 = vshufi64x2_avx512f(auVar82,auVar78,0x88);
                          auVar87 = vshufi64x2_avx512f(auVar95,auVar97,0x88);
                          auVar93 = vshufi64x2_avx512f(auVar99,auVar101,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar84,0xdd);
                          auVar84 = vshufi64x2_avx512f(auVar85,auVar88,0xdd);
                          auVar81 = vshufi64x2_avx512f(auVar81,auVar96,0xdd);
                          auVar85 = vshufi64x2_avx512f(auVar98,auVar100,0xdd);
                          auVar83 = vshufi64x2_avx512f(auVar83,auVar86,0xdd);
                          auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar95,auVar97,0xdd);
                          auVar86 = vshufi64x2_avx512f(auVar99,auVar101,0xdd);
                          auVar88 = vshufi64x2_avx512f(auVar90,auVar89,0x88);
                          auVar95 = vshufi64x2_avx512f(auVar92,auVar94,0x88);
                          auVar96 = vshufi64x2_avx512f(auVar91,auVar79,0x88);
                          auVar97 = vshufi64x2_avx512f(auVar87,auVar93,0x88);
                          auVar98 = vshufi64x2_avx512f(auVar80,auVar84,0x88);
                          auVar99 = vshufi64x2_avx512f(auVar81,auVar85,0x88);
                          auVar100 = vshufi64x2_avx512f(auVar83,auVar78,0x88);
                          auVar101 = vshufi64x2_avx512f(auVar82,auVar86,0x88);
                          auVar89 = vshufi64x2_avx512f(auVar90,auVar89,0xdd);
                          auVar90 = vshufi64x2_avx512f(auVar92,auVar94,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar91,auVar79,0xdd);
                          auVar87 = vshufi64x2_avx512f(auVar87,auVar93,0xdd);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar84,0xdd);
                          auVar81 = vshufi64x2_avx512f(auVar81,auVar85,0xdd);
                          auVar83 = vshufi64x2_avx512f(auVar83,auVar78,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar82,auVar86,0xdd);
                          auVar78 = vmovdqu64_avx512f(auVar88);
                          *pauVar49 = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar95);
                          *(undefined1 (*) [64])(*pauVar49 + lVar51 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar96);
                          *(undefined1 (*) [64])(*pauVar49 + lVar18 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar97);
                          *(undefined1 (*) [64])(*pauVar49 + lVar32 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar98);
                          *(undefined1 (*) [64])(*pauVar49 + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar99);
                          *(undefined1 (*) [64])(*pauVar49 + lVar33 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar100);
                          *(undefined1 (*) [64])(*pauVar49 + lVar34 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar101);
                          *(undefined1 (*) [64])(*pauVar49 + lVar35 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar89);
                          *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar90);
                          *(undefined1 (*) [64])(*pauVar49 + lVar36 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar79);
                          *(undefined1 (*) [64])(*pauVar49 + lVar37 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar87);
                          *(undefined1 (*) [64])(*pauVar49 + lVar45 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar80);
                          *(undefined1 (*) [64])(*pauVar49 + lVar60 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar81);
                          *(undefined1 (*) [64])(*pauVar49 + lVar56 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar83);
                          *(undefined1 (*) [64])(*pauVar49 + lVar46 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar82);
                          *(undefined1 (*) [64])(*pauVar49 + lVar48 * 4) = auVar78;
                          pauVar49 = pauVar49 + 1;
                        }
                        else if (iVar44 == 4) {
                          auVar80 = vshufi64x2_avx512f(auVar84,auVar95,0x88);
                          auVar83 = vshufi64x2_avx512f(auVar96,auVar97,0x88);
                          auVar86 = vshufi64x2_avx512f(auVar98,auVar99,0x88);
                          auVar90 = vshufi64x2_avx512f(auVar100,auVar101,0x88);
                          auVar91 = vshufi64x2_avx512f(auVar82,auVar85,0x88);
                          auVar92 = vshufi64x2_avx512f(auVar87,auVar88,0x88);
                          auVar93 = vshufi64x2_avx512f(auVar89,auVar79,0x88);
                          auVar94 = vshufi64x2_avx512f(auVar81,auVar78,0x88);
                          auVar84 = vshufi64x2_avx512f(auVar84,auVar95,0xdd);
                          auVar95 = vshufi64x2_avx512f(auVar96,auVar97,0xdd);
                          auVar96 = vshufi64x2_avx512f(auVar98,auVar99,0xdd);
                          auVar97 = vshufi64x2_avx512f(auVar100,auVar101,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar82,auVar85,0xdd);
                          auVar85 = vshufi64x2_avx512f(auVar87,auVar88,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar89,auVar79,0xdd);
                          auVar78 = vshufi64x2_avx512f(auVar81,auVar78,0xdd);
                          auVar81 = vshufi64x2_avx512f(auVar80,auVar83,0x88);
                          auVar87 = vshufi64x2_avx512f(auVar86,auVar90,0x88);
                          auVar88 = vshufi64x2_avx512f(auVar91,auVar92,0x88);
                          auVar89 = vshufi64x2_avx512f(auVar93,auVar94,0x88);
                          auVar98 = vshufi64x2_avx512f(auVar84,auVar95,0x88);
                          auVar99 = vshufi64x2_avx512f(auVar96,auVar97,0x88);
                          auVar100 = vshufi64x2_avx512f(auVar82,auVar85,0x88);
                          auVar101 = vshufi64x2_avx512f(auVar79,auVar78,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar83,0xdd);
                          auVar83 = vshufi64x2_avx512f(auVar86,auVar90,0xdd);
                          auVar86 = vshufi64x2_avx512f(auVar91,auVar92,0xdd);
                          auVar90 = vshufi64x2_avx512f(auVar93,auVar94,0xdd);
                          auVar84 = vshufi64x2_avx512f(auVar84,auVar95,0xdd);
                          auVar91 = vshufi64x2_avx512f(auVar96,auVar97,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar82,auVar85,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar79,auVar78,0xdd);
                          auVar78 = vmovdqu64_avx512f(auVar81);
                          *pauVar49 = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar87);
                          pauVar49[1] = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar88);
                          pauVar49[2] = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar89);
                          pauVar49[3] = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar98);
                          *(undefined1 (*) [64])(*pauVar49 + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar99);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar100);
                          *(undefined1 (*) [64])(pauVar49[2] + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar101);
                          *(undefined1 (*) [64])(pauVar49[3] + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar80);
                          *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar83);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar86);
                          *(undefined1 (*) [64])(pauVar49[2] + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar90);
                          *(undefined1 (*) [64])(pauVar49[3] + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar84);
                          *(undefined1 (*) [64])(*pauVar49 + lVar60 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar91);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar60 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar82);
                          *(undefined1 (*) [64])(pauVar49[2] + lVar60 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar79);
                          *(undefined1 (*) [64])(pauVar49[3] + lVar60 * 4) = auVar78;
                          pauVar49 = pauVar49 + 4;
                        }
                      }
                      else if (iVar44 == 8) {
                        auVar80 = vinserti64x4_avx512f(auVar84,auVar95._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *pauVar49 = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar96,auVar97._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[1] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar98,auVar99._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[2] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar100,auVar101._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[3] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar82,auVar85._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[4] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar87,auVar88._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[5] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar89,auVar79._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[6] = auVar80;
                        auVar80 = vinserti64x4_avx512f(auVar81,auVar78._0_32_,1);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        pauVar49[7] = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar84,auVar95,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar96,auVar97,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[1] + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar98,auVar99,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[2] + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar100,auVar101,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[3] + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar82,auVar85,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[4] + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar87,auVar88,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[5] + lVar19 * 4) = auVar80;
                        auVar79 = vshufi64x2_avx512f(auVar89,auVar79,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar49[6] + lVar19 * 4) = auVar79;
                        auVar78 = vshufi64x2_avx512f(auVar81,auVar78,0xee);
                        auVar78 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(pauVar49[7] + lVar19 * 4) = auVar78;
                        pauVar49 = pauVar49 + 8;
                      }
                      else if (iVar44 == 0x10) {
                        auVar80 = vmovdqa64_avx512f(auVar84);
                        *pauVar49 = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar95);
                        pauVar49[1] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar96);
                        pauVar49[2] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar97);
                        pauVar49[3] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar98);
                        pauVar49[4] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar99);
                        pauVar49[5] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar100);
                        pauVar49[6] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar101);
                        pauVar49[7] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar82);
                        pauVar49[8] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar85);
                        pauVar49[9] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar87);
                        pauVar49[10] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar88);
                        pauVar49[0xb] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar89);
                        pauVar49[0xc] = auVar80;
                        auVar79 = vmovdqa64_avx512f(auVar79);
                        pauVar49[0xd] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar81);
                        pauVar49[0xe] = auVar79;
                        auVar78 = vmovdqa64_avx512f(auVar78);
                        pauVar49[0xf] = auVar78;
                        pauVar49 = pauVar49 + 0x10;
                      }
                      iVar57 = iVar57 + 0x10;
                      pauVar28 = pauVar27 + 0x10;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 0x10;
                    uVar54 = uVar58 & 0xfffffff0;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 7) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar78 = vmovdqa64_avx512f(*pauVar27);
                      auVar79 = vmovdqa64_avx512f(pauVar27[2]);
                      auVar80 = vmovdqa64_avx512f(pauVar27[4]);
                      auVar81 = vpshufd_avx512f(pauVar27[1],0x93);
                      auVar82 = vpshufd_avx512f(pauVar27[3],0x93);
                      auVar83 = vpshufd_avx512f(pauVar27[5],0x93);
                      auVar84 = vmovdqa64_avx512f(pauVar27[6]);
                      auVar85 = vpshufd_avx512f(pauVar27[7],0x93);
                      auVar86 = vpunpckldq_avx512f(auVar78,auVar82);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar82);
                      auVar82 = vpunpckldq_avx512f(auVar79,auVar81);
                      auVar79 = vpunpckhdq_avx512f(auVar79,auVar81);
                      auVar81 = vpunpckldq_avx512f(auVar80,auVar85);
                      auVar80 = vpunpckhdq_avx512f(auVar80,auVar85);
                      auVar85 = vpunpckldq_avx512f(auVar84,auVar83);
                      auVar83 = vpunpckhdq_avx512f(auVar84,auVar83);
                      auVar84 = vpunpcklqdq_avx512f(auVar86,auVar82);
                      auVar87 = vpunpcklqdq_avx512f(auVar79,auVar78);
                      auVar88 = vpunpcklqdq_avx512f(auVar81,auVar85);
                      auVar89 = vpunpcklqdq_avx512f(auVar83,auVar80);
                      auVar82 = vpermt2d_avx512f(auVar82,auVar74,auVar86);
                      auVar78 = vpermt2d_avx512f(auVar78,auVar74,auVar79);
                      auVar79 = vpermt2d_avx512f(auVar85,auVar74,auVar81);
                      auVar80 = vpermt2d_avx512f(auVar80,auVar74,auVar83);
                      auVar81 = vshufi64x2_avx512f(auVar84,auVar88,0x14);
                      auVar83 = vshufi64x2_avx512f(auVar82,auVar79,0x14);
                      auVar85 = vshufi64x2_avx512f(auVar87,auVar89,0x14);
                      auVar86 = vshufi64x2_avx512f(auVar78,auVar80,0x14);
                      auVar84 = vshufi64x2_avx512f(auVar84,auVar88,0xbe);
                      auVar79 = vshufi64x2_avx512f(auVar82,auVar79,0xbe);
                      auVar82 = vshufi64x2_avx512f(auVar87,auVar89,0xbe);
                      auVar78 = vshufi64x2_avx512f(auVar78,auVar80,0xbe);
                      auVar80 = vshufi64x2_avx512f(auVar81,auVar84,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar83,auVar79,0x88);
                      auVar88 = vshufi64x2_avx512f(auVar85,auVar82,0x88);
                      auVar89 = vshufi64x2_avx512f(auVar86,auVar78,0x88);
                      auVar81 = vshufi64x2_avx512f(auVar81,auVar84,0x77);
                      auVar79 = vshufi64x2_avx512f(auVar83,auVar79,0x77);
                      auVar82 = vshufi64x2_avx512f(auVar85,auVar82,0x77);
                      auVar78 = vshufi64x2_avx512f(auVar86,auVar78,0x77);
                      if (iVar44 < 8) {
                        if (iVar44 == 1) {
                          auVar83 = vpunpckldq_avx512f(auVar80,auVar87);
                          auVar80 = vpunpckhdq_avx512f(auVar80,auVar87);
                          auVar84 = vpunpckldq_avx512f(auVar88,auVar89);
                          auVar85 = vpunpckhdq_avx512f(auVar88,auVar89);
                          auVar86 = vpunpckldq_avx512f(auVar81,auVar79);
                          auVar79 = vpunpckhdq_avx512f(auVar81,auVar79);
                          auVar81 = vpunpckldq_avx512f(auVar82,auVar78);
                          auVar78 = vpunpckhdq_avx512f(auVar82,auVar78);
                          auVar82 = vpunpckhqdq_avx512f(auVar83,auVar84);
                          auVar87 = vpunpckhqdq_avx512f(auVar80,auVar85);
                          auVar88 = vpunpckhqdq_avx512f(auVar86,auVar81);
                          auVar89 = vpunpckhqdq_avx512f(auVar79,auVar78);
                          auVar83 = vpunpcklqdq_avx512f(auVar83,auVar84);
                          auVar81 = vpunpcklqdq_avx512f(auVar86,auVar81);
                          auVar84 = vshufi64x2_avx512f(auVar83,auVar81,0x88);
                          auVar86 = vshufi64x2_avx512f(auVar82,auVar88,0x88);
                          auVar80 = vpunpcklqdq_avx512f(auVar80,auVar85);
                          auVar78 = vpunpcklqdq_avx512f(auVar79,auVar78);
                          auVar79 = vshufi64x2_avx512f(auVar80,auVar78,0x88);
                          auVar85 = vshufi64x2_avx512f(auVar87,auVar89,0x88);
                          auVar81 = vshufi64x2_avx512f(auVar83,auVar81,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar82,auVar88,0xdd);
                          auVar78 = vshufi64x2_avx512f(auVar80,auVar78,0xdd);
                          auVar80 = vshufi64x2_avx512f(auVar87,auVar89,0xdd);
                          auVar83 = vshufi64x2_avx512f(auVar84,auVar86,0x88);
                          auVar87 = vshufi64x2_avx512f(auVar79,auVar85,0x88);
                          auVar88 = vshufi64x2_avx512f(auVar81,auVar82,0x88);
                          auVar89 = vshufi64x2_avx512f(auVar78,auVar80,0x88);
                          auVar84 = vshufi64x2_avx512f(auVar84,auVar86,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar79,auVar85,0xdd);
                          auVar81 = vshufi64x2_avx512f(auVar81,auVar82,0xdd);
                          auVar78 = vshufi64x2_avx512f(auVar78,auVar80,0xdd);
                          *(undefined1 (*) [32])*pauVar49 = auVar83._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar83,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar51 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar18 * 4) = auVar87._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar87,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar32 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar50 * 4) = auVar88._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar88,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar34 * 4) = auVar89._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar89,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar35 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar19 * 4) = auVar84._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar84,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar36 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar37 * 4) = auVar79._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar79,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar45 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar60 * 4) = auVar81._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar81,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar56 * 4) = auVar68;
                          *(undefined1 (*) [32])(*pauVar49 + lVar46 * 4) = auVar78._0_32_;
                          auVar68 = vextracti64x4_avx512f(auVar78,1);
                          *(undefined1 (*) [32])(*pauVar49 + lVar48 * 4) = auVar68;
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        }
                        else if (iVar44 == 4) {
                          auVar83 = vshufi64x2_avx512f(auVar80,auVar87,0x88);
                          auVar84 = vshufi64x2_avx512f(auVar88,auVar89,0x88);
                          auVar85 = vshufi64x2_avx512f(auVar81,auVar79,0x88);
                          auVar86 = vshufi64x2_avx512f(auVar82,auVar78,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar87,0xdd);
                          auVar87 = vshufi64x2_avx512f(auVar88,auVar89,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar81,auVar79,0xdd);
                          auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0xdd);
                          auVar81 = vshufi64x2_avx512f(auVar83,auVar84,0x88);
                          auVar82 = vshufi64x2_avx512f(auVar85,auVar86,0x88);
                          auVar88 = vshufi64x2_avx512f(auVar80,auVar87,0x88);
                          auVar89 = vshufi64x2_avx512f(auVar79,auVar78,0x88);
                          auVar83 = vshufi64x2_avx512f(auVar83,auVar84,0xdd);
                          auVar84 = vshufi64x2_avx512f(auVar85,auVar86,0xdd);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar87,0xdd);
                          auVar79 = vshufi64x2_avx512f(auVar79,auVar78,0xdd);
                          auVar78 = vmovdqu64_avx512f(auVar81);
                          *pauVar49 = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar82);
                          pauVar49[1] = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar88);
                          *(undefined1 (*) [64])(*pauVar49 + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar89);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar83);
                          *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar84);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar80);
                          *(undefined1 (*) [64])(*pauVar49 + lVar60 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar79);
                          *(undefined1 (*) [64])(pauVar49[1] + lVar60 * 4) = auVar78;
                          pauVar49 = pauVar49 + 2;
                        }
                      }
                      else if (iVar44 == 8) {
                        auVar83 = vinserti64x4_avx512f(auVar80,auVar87._0_32_,1);
                        auVar83 = vmovdqu64_avx512f(auVar83);
                        *pauVar49 = auVar83;
                        auVar83 = vinserti64x4_avx512f(auVar88,auVar89._0_32_,1);
                        auVar83 = vmovdqu64_avx512f(auVar83);
                        pauVar49[1] = auVar83;
                        auVar83 = vinserti64x4_avx512f(auVar81,auVar79._0_32_,1);
                        auVar83 = vmovdqu64_avx512f(auVar83);
                        pauVar49[2] = auVar83;
                        auVar83 = vinserti64x4_avx512f(auVar82,auVar78._0_32_,1);
                        auVar83 = vmovdqu64_avx512f(auVar83);
                        pauVar49[3] = auVar83;
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar87,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar80;
                        auVar80 = vshufi64x2_avx512f(auVar88,auVar89,0xee);
                        auVar80 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar49[1] + lVar19 * 4) = auVar80;
                        auVar79 = vshufi64x2_avx512f(auVar81,auVar79,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar49[2] + lVar19 * 4) = auVar79;
                        auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0xee);
                        auVar78 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(pauVar49[3] + lVar19 * 4) = auVar78;
                        pauVar49 = pauVar49 + 4;
                      }
                      else if (iVar44 == 0x10) {
                        auVar80 = vmovdqa64_avx512f(auVar80);
                        *pauVar49 = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar87);
                        pauVar49[1] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar88);
                        pauVar49[2] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar89);
                        pauVar49[3] = auVar80;
                        auVar80 = vmovdqa64_avx512f(auVar81);
                        pauVar49[4] = auVar80;
                        auVar79 = vmovdqa64_avx512f(auVar79);
                        pauVar49[5] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar82);
                        pauVar49[6] = auVar79;
                        auVar78 = vmovdqa64_avx512f(auVar78);
                        pauVar49[7] = auVar78;
                        pauVar49 = pauVar49 + 8;
                      }
                      uVar54 = uVar29 + 8;
                      iVar57 = uVar29 + 0xf;
                      pauVar28 = pauVar27 + 8;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 8;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 3) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar78 = vmovdqa64_avx512f(*pauVar27);
                      auVar79 = vpshufd_avx512f(pauVar27[1],0x93);
                      auVar80 = vmovdqa64_avx512f(pauVar27[2]);
                      auVar81 = vpshufd_avx512f(pauVar27[3],0x93);
                      auVar82 = vpunpckldq_avx512f(auVar78,auVar81);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar81);
                      auVar81 = vpunpckldq_avx512f(auVar80,auVar79);
                      auVar79 = vpunpckhdq_avx512f(auVar80,auVar79);
                      auVar80 = vpunpcklqdq_avx512f(auVar82,auVar81);
                      auVar83 = vpunpcklqdq_avx512f(auVar79,auVar78);
                      auVar81 = vpermt2d_avx512f(auVar81,auVar74,auVar82);
                      auVar78 = vpermt2d_avx512f(auVar78,auVar74,auVar79);
                      if (iVar44 < 8) {
                        if (iVar44 == 1) {
                          auVar79 = vpunpckldq_avx512f(auVar80,auVar81);
                          auVar80 = vpunpckhdq_avx512f(auVar80,auVar81);
                          auVar81 = vpunpckldq_avx512f(auVar83,auVar78);
                          auVar78 = vpunpckhdq_avx512f(auVar83,auVar78);
                          auVar82 = vpunpckhqdq_avx512f(auVar79,auVar81);
                          auVar83 = vpunpckhqdq_avx512f(auVar80,auVar78);
                          auVar79 = vpunpcklqdq_avx512f(auVar79,auVar81);
                          auVar78 = vpunpcklqdq_avx512f(auVar80,auVar78);
                          *(undefined1 (*) [16])*pauVar49 = auVar79._0_16_;
                          *(undefined1 (*) [16])(*pauVar49 + lVar51 * 4) = auVar82._0_16_;
                          *(undefined1 (*) [16])(*pauVar49 + lVar18 * 4) = auVar78._0_16_;
                          *(undefined1 (*) [16])(*pauVar49 + lVar32 * 4) = auVar83._0_16_;
                          auVar65 = vextracti32x4_avx512f(auVar79,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar50 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar82,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar33 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar34 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar83,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar35 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar79,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar82,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar36 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar37 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar83,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar45 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar79,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar60 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar82,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar56 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar46 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar83,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar48 * 4) = auVar65;
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                        }
                        else if (iVar44 == 4) {
                          auVar79 = vinserti64x4_avx512f(auVar80,auVar81._0_32_,1);
                          auVar82 = vinserti64x4_avx512f(auVar83,auVar78._0_32_,1);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar81,0xee);
                          auVar78 = vshufi64x2_avx512f(auVar83,auVar78,0xee);
                          auVar81 = vshufi64x2_avx512f(auVar79,auVar82,0x88);
                          auVar79 = vshufi64x2_avx512f(auVar79,auVar82,0xdd);
                          auVar82 = vshufi64x2_avx512f(auVar80,auVar78,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar80,auVar78,0xdd);
                          auVar78 = vmovdqu64_avx512f(auVar81);
                          *pauVar49 = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar79);
                          *(undefined1 (*) [64])(*pauVar49 + lVar50 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar82);
                          *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                          auVar78 = vmovdqu64_avx512f(auVar80);
                          *(undefined1 (*) [64])(*pauVar49 + lVar60 * 4) = auVar78;
                          pauVar49 = pauVar49 + 1;
                        }
                      }
                      else if (iVar44 == 8) {
                        auVar79 = vinserti64x4_avx512f(auVar80,auVar81._0_32_,1);
                        auVar82 = vinserti64x4_avx512f(auVar83,auVar78._0_32_,1);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar81,0xee);
                        auVar81 = vshufi64x2_avx512f(auVar83,auVar78,0xee);
                        auVar78 = vmovdqu64_avx512f(auVar79);
                        *pauVar49 = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar82);
                        pauVar49[1] = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(pauVar49[1] + lVar19 * 4) = auVar78;
                        pauVar49 = pauVar49 + 2;
                      }
                      else if (iVar44 == 0x10) {
                        auVar79 = vmovdqa64_avx512f(auVar80);
                        *pauVar49 = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar81);
                        pauVar49[1] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar83);
                        pauVar49[2] = auVar79;
                        auVar78 = vmovdqa64_avx512f(auVar78);
                        pauVar49[3] = auVar78;
                        pauVar49 = pauVar49 + 4;
                      }
                      uVar54 = uVar29 + 4;
                      iVar57 = uVar29 + 7;
                      pauVar28 = pauVar27 + 4;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 4;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 1) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar78 = vpshufd_avx512f(*pauVar27,0xd8);
                      auVar79 = vpshufd_avx512f(pauVar27[1],0x2d);
                      auVar80 = vpunpckldq_avx512f(auVar78,auVar79);
                      auVar78 = vpermt2d_avx512f(auVar79,auVar73,auVar78);
                      if (iVar44 < 8) {
                        if (iVar44 == 1) {
                          vpscatterdd_avx512f(ZEXT864(pauVar49) + auVar77 * (undefined1  [64])0x4,
                                              0xffff,auVar80);
                          vpscatterdd_avx512f(ZEXT864(pauVar49) + ZEXT864(4) +
                                              auVar77 * (undefined1  [64])0x4,0xffff,auVar78);
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 8);
                        }
                        else if (iVar44 == 4) {
                          *(undefined1 (*) [16])(*pauVar49 + 0x10) = auVar78._0_16_;
                          *(undefined1 (*) [16])*pauVar49 = auVar80._0_16_;
                          auVar65 = vextracti32x4_avx512f(auVar78,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar50 * 4 + 8) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar80,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar50 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4 + 8) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar80,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar60 * 4 + 8) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar80,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar60 * 4) = auVar65;
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        }
                      }
                      else if (iVar44 == 8) {
                        auVar79 = vinserti64x4_avx512f(auVar80,auVar78._0_32_,1);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar78,0xee);
                        auVar78 = vmovdqu64_avx512f(auVar79);
                        *pauVar49 = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar78;
                        pauVar49 = pauVar49 + 1;
                      }
                      else if (iVar44 == 0x10) {
                        auVar79 = vmovdqa64_avx512f(auVar80);
                        *pauVar49 = auVar79;
                        auVar78 = vmovdqa64_avx512f(auVar78);
                        pauVar49[1] = auVar78;
                        pauVar49 = pauVar49 + 2;
                      }
                      uVar54 = uVar29 + 2;
                      iVar57 = uVar29 + 3;
                      pauVar28 = pauVar27 + 2;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 2;
                  }
                  iVar57 = uVar58 - uVar54;
                  if (iVar57 != 0 && (int)uVar54 <= (int)uVar58) {
                    do {
                      auVar78 = vmovdqa64_avx512f(*pauVar28);
                      if (iVar44 < 8) {
                        if (iVar44 == 1) {
                          vpscatterdd_avx512f(ZEXT864(pauVar49) + auVar77 * (undefined1  [64])0x4,
                                              0xffff,auVar78);
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 4);
                        }
                        else if (iVar44 == 4) {
                          *(undefined1 (*) [16])*pauVar49 = auVar78._0_16_;
                          auVar65 = vextracti32x4_avx512f(auVar78,1);
                          *(undefined1 (*) [16])(*pauVar49 + lVar50 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,2);
                          *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar65;
                          auVar65 = vextracti32x4_avx512f(auVar78,3);
                          *(undefined1 (*) [16])(*pauVar49 + lVar60 * 4) = auVar65;
                          pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                        }
                      }
                      else if (iVar44 == 8) {
                        *(undefined1 (*) [32])*pauVar49 = auVar78._0_32_;
                        auVar68 = vextracti64x4_avx512f(auVar78,1);
                        *(undefined1 (*) [32])(*pauVar49 + lVar19 * 4) = auVar68;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      }
                      else if (iVar44 == 0x10) {
                        auVar78 = vmovdqa64_avx512f(auVar78);
                        *pauVar49 = auVar78;
                        pauVar49 = pauVar49 + 1;
                      }
                      pauVar28 = pauVar28 + 1;
                      iVar57 = iVar57 + -1;
                    } while (iVar57 != 0);
                  }
                  lVar20 = lVar52 + 0x10;
                  uVar38 = lVar52 + 0x1f;
                  lVar52 = lVar20;
                  uVar17 = local_238;
                } while (uVar38 < uVar53);
              }
              if ((int)((uint)lVar20 | 7) < (int)uVar53) {
                lVar18 = (long)iVar21;
                lVar19 = (long)(iVar21 * 2);
                lVar32 = (long)(sVar6 * 0x300000000) >> 0x20;
                lVar33 = (long)(iVar21 * 4);
                lVar34 = (long)(sVar6 * 0x500000000) >> 0x20;
                lVar35 = (long)(sVar6 * 0x600000000) >> 0x20;
                lVar36 = (long)(sVar6 * 0x700000000) >> 0x20;
                auVar68 = vpbroadcastd_avx512vl();
                auVar68 = vpmulld_avx2(auVar68,_DAT_005b5320);
                lVar52 = (long)(int)(uint)lVar20;
                do {
                  pauVar49 = (undefined1 (*) [64])
                             ((long)local_248->data +
                             (long)(iVar44 * iVar47) * 4 + (lVar52 + local_258) * lVar18 * 4);
                  uVar54 = 0;
                  if (0xf < (int)uVar58) {
                    iVar57 = 0xf;
                    do {
                      pauVar27 = pauVar28;
                      auVar77 = vmovdqa64_avx512f(*pauVar27);
                      auVar78 = vmovdqa64_avx512f(pauVar27[2]);
                      auVar79 = vmovdqa64_avx512f(pauVar27[4]);
                      auVar80 = vpshufd_avx512f(pauVar27[1],0x93);
                      auVar81 = vpshufd_avx512f(pauVar27[3],0x93);
                      auVar82 = vpshufd_avx512f(pauVar27[5],0x93);
                      auVar83 = vmovdqa64_avx512f(pauVar27[6]);
                      auVar84 = vpshufd_avx512f(pauVar27[7],0x93);
                      auVar85 = vpunpckldq_avx512f(auVar77,auVar81);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar81);
                      auVar81 = vpunpckldq_avx512f(auVar78,auVar80);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar80);
                      auVar80 = vpunpckldq_avx512f(auVar79,auVar84);
                      auVar79 = vpunpckhdq_avx512f(auVar79,auVar84);
                      auVar84 = vpunpckldq_avx512f(auVar83,auVar82);
                      auVar82 = vpunpckhdq_avx512f(auVar83,auVar82);
                      auVar83 = vpunpcklqdq_avx512f(auVar85,auVar81);
                      auVar86 = vpunpcklqdq_avx512f(auVar78,auVar77);
                      auVar87 = vpunpcklqdq_avx512f(auVar80,auVar84);
                      auVar88 = vpunpcklqdq_avx512f(auVar82,auVar79);
                      auVar81 = vpermt2d_avx512f(auVar81,auVar74,auVar85);
                      auVar77 = vpermt2d_avx512f(auVar77,auVar74,auVar78);
                      auVar78 = vpermt2d_avx512f(auVar84,auVar74,auVar80);
                      auVar79 = vpermt2d_avx512f(auVar79,auVar74,auVar82);
                      auVar80 = vshufi64x2_avx512f(auVar83,auVar87,0x14);
                      auVar82 = vshufi64x2_avx512f(auVar83,auVar87,0xbe);
                      auVar83 = vshufi64x2_avx512f(auVar81,auVar78,0x14);
                      auVar78 = vshufi64x2_avx512f(auVar81,auVar78,0xbe);
                      auVar81 = vshufi64x2_avx512f(auVar86,auVar88,0x14);
                      auVar84 = vshufi64x2_avx512f(auVar86,auVar88,0xbe);
                      auVar85 = vshufi64x2_avx512f(auVar77,auVar79,0x14);
                      auVar77 = vshufi64x2_avx512f(auVar77,auVar79,0xbe);
                      auVar79 = vshufi64x2_avx512f(auVar80,auVar82,0x88);
                      auVar86 = vshufi64x2_avx512f(auVar83,auVar78,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar81,auVar84,0x88);
                      auVar88 = vshufi64x2_avx512f(auVar85,auVar77,0x88);
                      auVar80 = vshufi64x2_avx512f(auVar80,auVar82,0x77);
                      auVar78 = vshufi64x2_avx512f(auVar83,auVar78,0x77);
                      auVar81 = vshufi64x2_avx512f(auVar81,auVar84,0x77);
                      auVar77 = vshufi64x2_avx512f(auVar85,auVar77,0x77);
                      if (iVar44 == 1) {
                        auVar82 = vpunpckldq_avx512f(auVar79,auVar86);
                        auVar83 = vpunpckldq_avx512f(auVar87,auVar88);
                        auVar84 = vpunpckldq_avx512f(auVar80,auVar78);
                        auVar85 = vpunpckldq_avx512f(auVar81,auVar77);
                        auVar79 = vpunpckhdq_avx512f(auVar79,auVar86);
                        auVar86 = vpunpckhdq_avx512f(auVar87,auVar88);
                        auVar78 = vpunpckhdq_avx512f(auVar80,auVar78);
                        auVar77 = vpunpckhdq_avx512f(auVar81,auVar77);
                        auVar80 = vpunpcklqdq_avx512f(auVar82,auVar83);
                        auVar81 = vpunpcklqdq_avx512f(auVar84,auVar85);
                        auVar82 = vpunpckhqdq_avx512f(auVar82,auVar83);
                        auVar83 = vpunpckhqdq_avx512f(auVar84,auVar85);
                        auVar84 = vpunpcklqdq_avx512f(auVar79,auVar86);
                        auVar85 = vpunpcklqdq_avx512f(auVar78,auVar77);
                        auVar79 = vpunpckhqdq_avx512f(auVar79,auVar86);
                        auVar77 = vpunpckhqdq_avx512f(auVar78,auVar77);
                        auVar78 = vmovdqa64_avx512f(auVar80);
                        auVar78 = vpermt2q_avx512f(auVar78,auVar75,auVar81);
                        auVar86 = vmovdqa64_avx512f(auVar82);
                        auVar86 = vpermt2q_avx512f(auVar86,auVar75,auVar83);
                        auVar87 = vmovdqa64_avx512f(auVar84);
                        auVar87 = vpermt2q_avx512f(auVar87,auVar75,auVar85);
                        auVar88 = vmovdqa64_avx512f(auVar79);
                        auVar88 = vpermt2q_avx512f(auVar88,auVar75,auVar77);
                        auVar80 = vpermt2q_avx512f(auVar80,auVar76,auVar81);
                        auVar81 = vpermt2q_avx512f(auVar82,auVar76,auVar83);
                        auVar82 = vpermt2q_avx512f(auVar84,auVar76,auVar85);
                        auVar79 = vpermt2q_avx512f(auVar79,auVar76,auVar77);
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        *pauVar49 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar86);
                        *(undefined1 (*) [64])(*pauVar49 + lVar18 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar87);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar88);
                        *(undefined1 (*) [64])(*pauVar49 + lVar32 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar49 + lVar33 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar49 + lVar34 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(*pauVar49 + lVar35 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar49 + lVar36 * 4) = auVar77;
                        pauVar49 = pauVar49 + 1;
                      }
                      else if (iVar44 == 4) {
                        auVar82 = vshufi64x2_avx512f(auVar79,auVar86,0x88);
                        auVar83 = vshufi64x2_avx512f(auVar87,auVar88,0x88);
                        auVar84 = vshufi64x2_avx512f(auVar80,auVar78,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar81,auVar77,0x88);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar86,0xdd);
                        auVar86 = vshufi64x2_avx512f(auVar87,auVar88,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar80,auVar78,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar81,auVar77,0xdd);
                        auVar80 = vshufi64x2_avx512f(auVar82,auVar83,0x88);
                        auVar81 = vshufi64x2_avx512f(auVar84,auVar85,0x88);
                        auVar82 = vshufi64x2_avx512f(auVar82,auVar83,0xdd);
                        auVar83 = vshufi64x2_avx512f(auVar84,auVar85,0xdd);
                        auVar84 = vshufi64x2_avx512f(auVar79,auVar86,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar78,auVar77,0x88);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar86,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar78,auVar77,0xdd);
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        *pauVar49 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar81);
                        pauVar49[1] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar82);
                        pauVar49[2] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar83);
                        pauVar49[3] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar84);
                        *(undefined1 (*) [64])(*pauVar49 + lVar33 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar85);
                        *(undefined1 (*) [64])(pauVar49[1] + lVar33 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar49[2] + lVar33 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(pauVar49[3] + lVar33 * 4) = auVar77;
                        pauVar49 = pauVar49 + 4;
                      }
                      else if (iVar44 == 8) {
                        auVar82 = vinserti64x4_avx512f(auVar79,auVar86._0_32_,1);
                        auVar83 = vinserti64x4_avx512f(auVar87,auVar88._0_32_,1);
                        auVar84 = vinserti64x4_avx512f(auVar80,auVar78._0_32_,1);
                        auVar85 = vinserti64x4_avx512f(auVar81,auVar77._0_32_,1);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar86,0xee);
                        auVar86 = vshufi64x2_avx512f(auVar87,auVar88,0xee);
                        auVar78 = vshufi64x2_avx512f(auVar80,auVar78,0xee);
                        auVar80 = vshufi64x2_avx512f(auVar81,auVar77,0xee);
                        auVar77 = vmovdqu64_avx512f(auVar82);
                        *pauVar49 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar83);
                        pauVar49[1] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar84);
                        pauVar49[2] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar85);
                        pauVar49[3] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        pauVar49[4] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar86);
                        pauVar49[5] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        pauVar49[6] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        pauVar49[7] = auVar77;
                        pauVar49 = pauVar49 + 8;
                      }
                      iVar57 = iVar57 + 0x10;
                      pauVar28 = pauVar27 + 8;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 8;
                    uVar54 = uVar58 & 0xfffffff0;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 7) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar72 = *(undefined1 (*) [32])*pauVar27;
                      auVar107 = *(undefined1 (*) [32])(*pauVar27 + 0x20);
                      auVar66 = *(undefined1 (*) [32])pauVar27[1];
                      auVar71 = *(undefined1 (*) [32])(pauVar27[1] + 0x20);
                      auVar110 = *(undefined1 (*) [32])pauVar27[2];
                      auVar67 = *(undefined1 (*) [32])(pauVar27[2] + 0x20);
                      auVar2 = *(undefined1 (*) [32])pauVar27[3];
                      auVar111 = *(undefined1 (*) [32])(pauVar27[3] + 0x20);
                      auVar12 = vpshufd_avx2(auVar107,0x93);
                      auVar112 = vpshufd_avx2(auVar71,0x93);
                      auVar113 = vpshufd_avx2(auVar67,0x93);
                      auVar115 = vpshufd_avx2(auVar111,0x93);
                      auVar116 = vpunpckldq_avx2(auVar72,auVar112);
                      auVar112 = vpunpckhdq_avx2(auVar72,auVar112);
                      auVar70 = vpunpckldq_avx2(auVar66,auVar12);
                      auVar12 = vpunpckhdq_avx2(auVar66,auVar12);
                      auVar114 = vpunpckldq_avx2(auVar110,auVar115);
                      auVar115 = vpunpckhdq_avx2(auVar110,auVar115);
                      auVar69 = vpunpckldq_avx512vl(auVar2,auVar113);
                      auVar113 = vpunpckhdq_avx2(auVar2,auVar113);
                      auVar116 = vpunpcklqdq_avx2(auVar116,auVar70);
                      auVar12 = vpunpcklqdq_avx2(auVar12,auVar112);
                      auVar70 = vpunpcklqdq_avx512vl(auVar114,auVar69);
                      auVar112 = vpunpcklqdq_avx2(auVar113,auVar115);
                      auVar113 = vpunpcklqdq_avx2(auVar72,auVar71);
                      auVar115 = vpunpcklqdq_avx2(auVar107,auVar66);
                      auVar113 = vpblendd_avx2(auVar115,auVar113,0x66);
                      auVar107 = vpunpckhqdq_avx2(auVar66,auVar107);
                      auVar72 = vpunpckhqdq_avx2(auVar71,auVar72);
                      auVar66 = vpblendd_avx2(auVar72,auVar107,0x66);
                      auVar72 = vpunpcklqdq_avx2(auVar110,auVar111);
                      auVar107 = vpunpcklqdq_avx2(auVar67,auVar2);
                      auVar71 = vpblendd_avx2(auVar107,auVar72,0x66);
                      auVar72 = vpunpckhqdq_avx2(auVar2,auVar67);
                      auVar107 = vpunpckhqdq_avx2(auVar111,auVar110);
                      auVar72 = vpblendd_avx2(auVar107,auVar72,0x66);
                      auVar107 = vpblendd_avx2(auVar116,auVar70,0xf0);
                      auVar110 = vpblendd_avx2(auVar113,auVar71,0xf0);
                      auVar67 = vpblendd_avx2(auVar12,auVar112,0xf0);
                      auVar2 = vpblendd_avx2(auVar66,auVar72,0xf0);
                      auVar111 = vpblendd_avx2(auVar70,auVar116,0xf0);
                      auVar71 = vpblendd_avx2(auVar71,auVar113,0xf0);
                      auVar12 = vpblendd_avx2(auVar112,auVar12,0xf0);
                      auVar72 = vpblendd_avx2(auVar72,auVar66,0xf0);
                      if (iVar44 == 1) {
                        auVar112 = vpunpckldq_avx2(auVar107,auVar110);
                        auVar107 = vpunpckhdq_avx2(auVar107,auVar110);
                        auVar110 = vpunpckldq_avx2(auVar67,auVar2);
                        auVar66 = vpunpckhdq_avx2(auVar67,auVar2);
                        auVar2 = vpunpckldq_avx2(auVar111,auVar71);
                        auVar71 = vpunpckhdq_avx2(auVar111,auVar71);
                        auVar111 = vpunpckldq_avx2(auVar12,auVar72);
                        auVar72 = vpunpckhdq_avx2(auVar12,auVar72);
                        auVar12 = vpunpcklqdq_avx2(auVar112,auVar110);
                        auVar110 = vpunpckhqdq_avx2(auVar112,auVar110);
                        auVar112 = vpunpcklqdq_avx2(auVar107,auVar66);
                        auVar67 = vpunpckhqdq_avx2(auVar107,auVar66);
                        auVar66 = vpunpcklqdq_avx2(auVar2,auVar111);
                        auVar107 = vpunpckhqdq_avx2(auVar2,auVar111);
                        auVar2 = vpunpcklqdq_avx2(auVar71,auVar72);
                        auVar71 = vpunpckhqdq_avx2(auVar71,auVar72);
                        auVar111._0_16_ = ZEXT116(0) * auVar66._0_16_ + ZEXT116(1) * auVar12._0_16_;
                        auVar111._16_16_ =
                             ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar66._0_16_;
                        auVar113._0_16_ =
                             ZEXT116(0) * auVar107._0_16_ + ZEXT116(1) * auVar110._0_16_;
                        auVar113._16_16_ =
                             ZEXT116(0) * auVar110._16_16_ + ZEXT116(1) * auVar107._0_16_;
                        auVar115._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar112._0_16_;
                        auVar115._16_16_ =
                             ZEXT116(0) * auVar112._16_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar116._0_16_ = ZEXT116(0) * auVar71._0_16_ + ZEXT116(1) * auVar67._0_16_;
                        auVar116._16_16_ =
                             ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar71._0_16_;
                        auVar72 = vperm2f128_avx(auVar12,auVar66,0x31);
                        auVar107 = vperm2f128_avx(auVar110,auVar107,0x31);
                        auVar66 = vperm2f128_avx(auVar112,auVar2,0x31);
                        auVar71 = vperm2f128_avx(auVar67,auVar71,0x31);
                        *(undefined1 (*) [32])*pauVar49 = auVar111;
                        *(undefined1 (*) [32])(*pauVar49 + lVar18 * 4) = auVar113;
                        *(undefined1 (*) [32])(*pauVar49 + lVar19 * 4) = auVar115;
                        *(undefined1 (*) [32])(*pauVar49 + lVar32 * 4) = auVar116;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4) = auVar72;
                        *(undefined1 (*) [32])(*pauVar49 + lVar34 * 4) = auVar107;
                        *(undefined1 (*) [32])(*pauVar49 + lVar35 * 4) = auVar66;
                        *(undefined1 (*) [32])(*pauVar49 + lVar36 * 4) = auVar71;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      }
                      else if (iVar44 == 4) {
                        auVar112._0_16_ =
                             ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar107._0_16_;
                        auVar112._16_16_ =
                             ZEXT116(0) * auVar107._16_16_ + ZEXT116(1) * auVar110._0_16_;
                        auVar70._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar67._0_16_;
                        auVar70._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar114._0_16_ = ZEXT116(0) * auVar71._0_16_ + ZEXT116(1) * auVar111._0_16_
                        ;
                        auVar114._16_16_ =
                             ZEXT116(0) * auVar111._16_16_ + ZEXT116(1) * auVar71._0_16_;
                        auVar69._0_16_ = ZEXT116(0) * auVar72._0_16_ + ZEXT116(1) * auVar12._0_16_;
                        auVar69._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar72._0_16_
                        ;
                        auVar107 = vperm2i128_avx2(auVar107,auVar110,0x31);
                        auVar66 = vperm2i128_avx2(auVar67,auVar2,0x31);
                        auVar71 = vperm2i128_avx2(auVar111,auVar71,0x31);
                        auVar72 = vperm2i128_avx2(auVar12,auVar72,0x31);
                        *(undefined1 (*) [32])*pauVar49 = auVar112;
                        *(undefined1 (*) [32])(*pauVar49 + 0x20) = auVar70;
                        *(undefined1 (*) [32])pauVar49[1] = auVar114;
                        *(undefined1 (*) [32])(pauVar49[1] + 0x20) = auVar69;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4) = auVar107;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4 + 0x20) = auVar66;
                        *(undefined1 (*) [32])(pauVar49[1] + lVar33 * 4) = auVar71;
                        *(undefined1 (*) [32])(pauVar49[1] + lVar33 * 4 + 0x20) = auVar72;
                        pauVar49 = pauVar49 + 2;
                      }
                      else if (iVar44 == 8) {
                        *(undefined1 (*) [32])*pauVar49 = auVar107;
                        *(undefined1 (*) [32])(*pauVar49 + 0x20) = auVar110;
                        *(undefined1 (*) [32])pauVar49[1] = auVar67;
                        *(undefined1 (*) [32])(pauVar49[1] + 0x20) = auVar2;
                        *(undefined1 (*) [32])pauVar49[2] = auVar111;
                        *(undefined1 (*) [32])(pauVar49[2] + 0x20) = auVar71;
                        *(undefined1 (*) [32])pauVar49[3] = auVar12;
                        *(undefined1 (*) [32])(pauVar49[3] + 0x20) = auVar72;
                        pauVar49 = pauVar49 + 4;
                      }
                      uVar54 = uVar29 + 8;
                      iVar57 = uVar29 + 0xf;
                      pauVar28 = pauVar27 + 4;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 4;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 3) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar72 = vpshufd_avx2(*(undefined1 (*) [32])(*pauVar27 + 0x20),0x93);
                      auVar107 = vpshufd_avx2(*(undefined1 (*) [32])(pauVar27[1] + 0x20),0x93);
                      auVar71 = vpunpckldq_avx2(*(undefined1 (*) [32])*pauVar27,auVar107);
                      auVar107 = vpunpckhdq_avx2(*(undefined1 (*) [32])*pauVar27,auVar107);
                      auVar110 = vpunpckldq_avx2(*(undefined1 (*) [32])pauVar27[1],auVar72);
                      auVar66 = vpunpckhdq_avx2(*(undefined1 (*) [32])pauVar27[1],auVar72);
                      auVar67 = vpunpcklqdq_avx2(auVar71,auVar110);
                      auVar2 = vpunpcklqdq_avx2(auVar66,auVar107);
                      auVar72 = vpmovsxbd_avx2(ZEXT816(0x60f0e07020b0a03));
                      auVar71 = vpermt2d_avx512vl(auVar110,auVar72,auVar71);
                      auVar72 = vpermt2d_avx512vl(auVar107,auVar72,auVar66);
                      if (iVar44 == 1) {
                        auVar66 = vpunpckldq_avx2(auVar67,auVar71);
                        auVar107 = vpunpckhdq_avx2(auVar67,auVar71);
                        auVar71 = vpunpckldq_avx2(auVar2,auVar72);
                        auVar72 = vpunpckhdq_avx2(auVar2,auVar72);
                        auVar110 = vpunpcklqdq_avx2(auVar66,auVar71);
                        auVar66 = vpunpckhqdq_avx2(auVar66,auVar71);
                        auVar71 = vpunpcklqdq_avx2(auVar107,auVar72);
                        auVar72 = vpunpckhqdq_avx2(auVar107,auVar72);
                        *(undefined1 (*) [16])*pauVar49 = auVar110._0_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar18 * 4) = auVar66._0_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar71._0_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar32 * 4) = auVar72._0_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar33 * 4) = auVar110._16_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar34 * 4) = auVar66._16_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar35 * 4) = auVar71._16_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar36 * 4) = auVar72._16_16_;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      }
                      else if (iVar44 == 4) {
                        auVar66._0_16_ = ZEXT116(0) * auVar71._0_16_ + ZEXT116(1) * auVar67._0_16_;
                        auVar66._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar71._0_16_
                        ;
                        auVar110._0_16_ = ZEXT116(0) * auVar72._0_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar110._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar72._0_16_
                        ;
                        auVar107 = vperm2i128_avx2(auVar67,auVar71,0x31);
                        auVar72 = vperm2i128_avx2(auVar2,auVar72,0x31);
                        *(undefined1 (*) [32])*pauVar49 = auVar66;
                        *(undefined1 (*) [32])(*pauVar49 + 0x20) = auVar110;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4) = auVar107;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4 + 0x20) = auVar72;
                        pauVar49 = pauVar49 + 1;
                      }
                      else if (iVar44 == 8) {
                        *(undefined1 (*) [32])*pauVar49 = auVar67;
                        *(undefined1 (*) [32])(*pauVar49 + 0x20) = auVar71;
                        *(undefined1 (*) [32])pauVar49[1] = auVar2;
                        *(undefined1 (*) [32])(pauVar49[1] + 0x20) = auVar72;
                        pauVar49 = pauVar49 + 2;
                      }
                      uVar54 = uVar29 + 4;
                      iVar57 = uVar29 + 7;
                      pauVar28 = pauVar27 + 2;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 2;
                  }
                  uVar29 = uVar54;
                  if ((int)(uVar54 | 1) < (int)uVar58) {
                    do {
                      pauVar27 = pauVar28;
                      auVar72 = vpblendd_avx2(*(undefined1 (*) [32])*pauVar27,
                                              *(undefined1 (*) [32])(*pauVar27 + 0x20),0xaa);
                      auVar107 = vpblendd_avx2(*(undefined1 (*) [32])(*pauVar27 + 0x20),
                                               *(undefined1 (*) [32])*pauVar27,0xaa);
                      if (iVar44 == 1) {
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar49) + auVar68 * (undefined1  [32])0x4,0xffff,
                                   auVar72);
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar49) + ZEXT832(4) + auVar68 * (undefined1  [32])0x4,
                                   0xffff,auVar107);
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 8);
                      }
                      else if (iVar44 == 4) {
                        auVar71._0_16_ = ZEXT116(0) * auVar107._0_16_ + ZEXT116(1) * auVar72._0_16_;
                        auVar71._16_16_ =
                             ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar107._0_16_;
                        auVar72 = vperm2i128_avx2(auVar72,auVar107,0x31);
                        *(undefined1 (*) [32])*pauVar49 = auVar71;
                        *(undefined1 (*) [32])(*pauVar49 + lVar33 * 4) = auVar72;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      }
                      else if (iVar44 == 8) {
                        *(undefined1 (*) [32])*pauVar49 = auVar72;
                        *(undefined1 (*) [32])(*pauVar49 + 0x20) = auVar107;
                        pauVar49 = pauVar49 + 1;
                      }
                      uVar54 = uVar29 + 2;
                      iVar57 = uVar29 + 3;
                      pauVar28 = pauVar27 + 1;
                      uVar29 = uVar54;
                    } while (iVar57 < (int)uVar58);
                    pauVar28 = pauVar27 + 1;
                  }
                  iVar57 = uVar58 - uVar54;
                  if (iVar57 != 0 && (int)uVar54 <= (int)uVar58) {
                    do {
                      auVar72 = *(undefined1 (*) [32])*pauVar28;
                      if (iVar44 == 1) {
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar49) + auVar68 * (undefined1  [32])0x4,0xffff,
                                   auVar72);
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 4);
                      }
                      else if (iVar44 == 4) {
                        *(undefined1 (*) [16])*pauVar49 = auVar72._0_16_;
                        *(undefined1 (*) [16])(*pauVar49 + lVar33 * 4) = auVar72._16_16_;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      }
                      else if (iVar44 == 8) {
                        *(undefined1 (*) [32])*pauVar49 = auVar72;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      }
                      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                      iVar57 = iVar57 + -1;
                    } while (iVar57 != 0);
                  }
                  lVar20 = lVar52 + 8;
                  lVar37 = lVar52 + 0xf;
                  uVar17 = local_238;
                  lVar52 = lVar20;
                } while (lVar37 < (long)local_78._0_8_);
              }
              if ((int)((uint)lVar20 | 3) < (int)uVar53) {
                lVar18 = (long)iVar21;
                lVar19 = (long)(iVar21 * 2);
                lVar32 = (long)(sVar6 * 0x300000000) >> 0x20;
                auVar65 = vpbroadcastd_avx512vl();
                auVar65 = vpmulld_avx(auVar65,_DAT_005b3950);
                lVar52 = (long)(int)(uint)lVar20;
                do {
                  pauVar49 = (undefined1 (*) [64])
                             ((long)local_248->data +
                             (long)(iVar44 * iVar47) * 4 + (local_258 + lVar52) * lVar18 * 4);
                  uVar54 = 0;
                  if (0xf < (int)uVar58) {
                    iVar57 = 0xf;
                    do {
                      auVar77 = vmovdqu64_avx512f(*pauVar28);
                      auVar78 = vpshufd_avx512f(pauVar28[1],0x93);
                      auVar79 = vmovdqu64_avx512f(pauVar28[2]);
                      auVar80 = vpshufd_avx512f(pauVar28[3],0x93);
                      auVar81 = vpunpckldq_avx512f(auVar77,auVar80);
                      auVar82 = vpunpckldq_avx512f(auVar79,auVar78);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar80);
                      auVar78 = vpunpckhdq_avx512f(auVar79,auVar78);
                      auVar79 = vpunpcklqdq_avx512f(auVar81,auVar82);
                      auVar80 = vpunpcklqdq_avx512f(auVar78,auVar77);
                      auVar81 = vpermt2d_avx512f(auVar82,auVar74,auVar81);
                      auVar77 = vpermt2d_avx512f(auVar77,auVar74,auVar78);
                      if (iVar44 == 1) {
                        auVar78 = vpunpckldq_avx512f(auVar79,auVar81);
                        auVar82 = vpunpckldq_avx512f(auVar80,auVar77);
                        auVar79 = vpunpckhdq_avx512f(auVar79,auVar81);
                        auVar77 = vpunpckhdq_avx512f(auVar80,auVar77);
                        auVar80 = vpunpcklqdq_avx512f(auVar78,auVar82);
                        auVar78 = vpunpckhqdq_avx512f(auVar78,auVar82);
                        auVar81 = vpunpcklqdq_avx512f(auVar79,auVar77);
                        auVar79 = vpunpckhqdq_avx512f(auVar79,auVar77);
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        *pauVar49 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(*pauVar49 + lVar18 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar49 + lVar19 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar49 + lVar32 * 4) = auVar77;
                        pauVar49 = pauVar49 + 1;
                      }
                      else if (iVar44 == 4) {
                        auVar78 = vinserti64x4_avx512f(auVar79,auVar81._0_32_,1);
                        auVar82 = vinserti64x4_avx512f(auVar80,auVar77._0_32_,1);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar81,0xee);
                        auVar77 = vshufi64x2_avx512f(auVar80,auVar77,0xee);
                        auVar80 = vshufi64x2_avx512f(auVar78,auVar82,0x88);
                        auVar78 = vshufi64x2_avx512f(auVar78,auVar82,0xdd);
                        auVar81 = vshufi64x2_avx512f(auVar79,auVar77,0x88);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar77,0xdd);
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        *pauVar49 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        pauVar49[1] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar81);
                        pauVar49[2] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        pauVar49[3] = auVar77;
                        pauVar49 = pauVar49 + 4;
                      }
                      pauVar28 = pauVar28 + 4;
                      iVar57 = iVar57 + 0x10;
                      uVar54 = uVar58 & 0xfffffff0;
                    } while (iVar57 < (int)uVar58);
                  }
                  uVar29 = uVar54 | 7;
                  while ((int)uVar29 < (int)uVar58) {
                    auVar62 = vpshufd_avx(*(undefined1 (*) [16])pauVar28[1],0x93);
                    auVar63 = vpshufd_avx(*(undefined1 (*) [16])(pauVar28[1] + 0x10),0x93);
                    auVar106 = vpshufd_avx(*(undefined1 (*) [16])(pauVar28[1] + 0x20),0x93);
                    auVar64 = vpshufd_avx(*(undefined1 (*) [16])(pauVar28[1] + 0x30),0x93);
                    auVar102 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar28,auVar106);
                    auVar106 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar28,auVar106);
                    auVar104 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x10),auVar64);
                    auVar64 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x10),auVar64);
                    auVar103 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x20),auVar62);
                    auVar109 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x20),auVar62);
                    auVar105 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x30),auVar63);
                    auVar108 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x30),auVar63);
                    auVar8 = vpunpcklqdq_avx(auVar102,auVar103);
                    auVar9 = vpunpcklqdq_avx(auVar109,auVar106);
                    auVar10 = vpunpcklqdq_avx(auVar104,auVar105);
                    auVar11 = vpunpcklqdq_avx(auVar108,auVar64);
                    auVar62 = vpunpckhdq_avx(auVar103,auVar102);
                    auVar62 = vpshufd_avx(auVar62,0x36);
                    auVar63 = vpunpckhdq_avx(auVar106,auVar109);
                    auVar63 = vpshufd_avx(auVar63,0x36);
                    auVar106 = vpunpckhdq_avx(auVar105,auVar104);
                    auVar106 = vpshufd_avx(auVar106,0x36);
                    auVar64 = vpunpckhdq_avx(auVar64,auVar108);
                    auVar64 = vpshufd_avx(auVar64,0x36);
                    if (iVar44 == 1) {
                      auVar109 = vpunpckldq_avx(auVar8,auVar62);
                      auVar62 = vpunpckhdq_avx(auVar8,auVar62);
                      auVar108 = vpunpckldq_avx(auVar9,auVar63);
                      auVar63 = vpunpckhdq_avx(auVar9,auVar63);
                      auVar104 = vpunpcklqdq_avx(auVar109,auVar108);
                      auVar109 = vpunpckhqdq_avx(auVar109,auVar108);
                      auVar103 = vpunpcklqdq_avx(auVar62,auVar63);
                      auVar108 = vpunpckhqdq_avx(auVar62,auVar63);
                      auVar102 = vpunpckldq_avx(auVar10,auVar106);
                      auVar62 = vpunpckhdq_avx(auVar10,auVar106);
                      auVar106 = vpunpckldq_avx(auVar11,auVar64);
                      auVar63 = vpunpckhdq_avx(auVar11,auVar64);
                      auVar64 = vpunpcklqdq_avx(auVar102,auVar106);
                      auVar106 = vpunpckhqdq_avx(auVar102,auVar106);
                      auVar102 = vpunpcklqdq_avx(auVar62,auVar63);
                      auVar62 = vpunpckhqdq_avx(auVar62,auVar63);
                      *(undefined1 (*) [16])*pauVar49 = auVar104;
                      *(undefined1 (*) [16])(*pauVar49 + 0x10) = auVar64;
                      *(undefined1 (*) [16])(*pauVar49 + lVar18 * 4) = auVar109;
                      *(undefined1 (*) [16])(*pauVar49 + lVar18 * 4 + 0x10) = auVar106;
                      *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar103;
                      *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4 + 0x10) = auVar102;
                      *(undefined1 (*) [16])(*pauVar49 + lVar32 * 4) = auVar108;
                      *(undefined1 (*) [16])(*pauVar49 + lVar32 * 4 + 0x10) = auVar62;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    }
                    else if (iVar44 == 4) {
                      *(undefined1 (*) [16])*pauVar49 = auVar8;
                      *(undefined1 (*) [16])(*pauVar49 + 0x10) = auVar62;
                      *(undefined1 (*) [16])(*pauVar49 + 0x20) = auVar9;
                      *(undefined1 (*) [16])(*pauVar49 + 0x30) = auVar63;
                      *(undefined1 (*) [16])pauVar49[1] = auVar10;
                      *(undefined1 (*) [16])(pauVar49[1] + 0x10) = auVar106;
                      *(undefined1 (*) [16])(pauVar49[1] + 0x20) = auVar11;
                      *(undefined1 (*) [16])(pauVar49[1] + 0x30) = auVar64;
                      pauVar49 = pauVar49 + 2;
                    }
                    pauVar28 = pauVar28 + 2;
                    uVar29 = uVar54 + 0xf;
                    uVar54 = uVar54 + 8;
                  }
                  uVar29 = uVar54 | 3;
                  while ((int)uVar29 < (int)uVar58) {
                    auVar62 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar28 + 0x10),0x93);
                    auVar63 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar28 + 0x30),0x93);
                    auVar64 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar28,auVar63);
                    auVar63 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar28,auVar63);
                    auVar109 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x20),auVar62);
                    auVar106 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar28 + 0x20),auVar62);
                    auVar108 = vpunpcklqdq_avx(auVar64,auVar109);
                    auVar102 = vpunpcklqdq_avx(auVar106,auVar63);
                    auVar62 = vpunpckhdq_avx(auVar109,auVar64);
                    auVar62 = vpshufd_avx(auVar62,0x36);
                    auVar63 = vpunpckhdq_avx(auVar63,auVar106);
                    auVar63 = vpshufd_avx(auVar63,0x36);
                    if (iVar44 == 1) {
                      auVar106 = vpunpckldq_avx(auVar108,auVar62);
                      auVar62 = vpunpckhdq_avx(auVar108,auVar62);
                      auVar64 = vpunpckldq_avx(auVar102,auVar63);
                      auVar63 = vpunpckhdq_avx(auVar102,auVar63);
                      auVar109 = vpunpcklqdq_avx(auVar106,auVar64);
                      auVar106 = vpunpckhqdq_avx(auVar106,auVar64);
                      auVar64 = vpunpcklqdq_avx(auVar62,auVar63);
                      auVar62 = vpunpckhqdq_avx(auVar62,auVar63);
                      *(undefined1 (*) [16])*pauVar49 = auVar109;
                      *(undefined1 (*) [16])(*pauVar49 + lVar18 * 4) = auVar106;
                      *(undefined1 (*) [16])(*pauVar49 + lVar19 * 4) = auVar64;
                      *(undefined1 (*) [16])(*pauVar49 + lVar32 * 4) = auVar62;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    }
                    else if (iVar44 == 4) {
                      *(undefined1 (*) [16])*pauVar49 = auVar108;
                      *(undefined1 (*) [16])(*pauVar49 + 0x10) = auVar62;
                      *(undefined1 (*) [16])(*pauVar49 + 0x20) = auVar102;
                      *(undefined1 (*) [16])(*pauVar49 + 0x30) = auVar63;
                      pauVar49 = pauVar49 + 1;
                    }
                    pauVar28 = pauVar28 + 1;
                    uVar29 = uVar54 + 7;
                    uVar54 = uVar54 + 4;
                  }
                  uVar29 = uVar54 | 1;
                  while ((int)uVar29 < (int)uVar58) {
                    auVar62 = vpblendd_avx2(*(undefined1 (*) [16])*pauVar28,
                                            *(undefined1 (*) [16])(*pauVar28 + 0x10),10);
                    auVar63 = vpblendd_avx2(*(undefined1 (*) [16])(*pauVar28 + 0x10),
                                            *(undefined1 (*) [16])*pauVar28,10);
                    if (iVar44 == 1) {
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = pauVar49;
                      vpscatterdd_avx512vl(auVar8 + auVar65 * (undefined1  [16])0x4,0xffff,auVar62);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = pauVar49;
                      vpscatterdd_avx512vl
                                (auVar9 + ZEXT816(4) + auVar65 * (undefined1  [16])0x4,0xffff,
                                 auVar63);
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 8);
                    }
                    else if (iVar44 == 4) {
                      *(undefined1 (*) [16])*pauVar49 = auVar62;
                      *(undefined1 (*) [16])(*pauVar49 + 0x10) = auVar63;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    }
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                    uVar29 = uVar54 + 3;
                    uVar54 = uVar54 + 2;
                  }
                  iVar57 = uVar58 - uVar54;
                  if (iVar57 != 0 && (int)uVar54 <= (int)uVar58) {
                    do {
                      if (iVar44 == 1) {
                        auVar10._8_8_ = 0;
                        auVar10._0_8_ = pauVar49;
                        vpscatterdd_avx512vl
                                  (auVar10 + auVar65 * (undefined1  [16])0x4,0xffff,
                                   *(undefined1 (*) [16])*pauVar28);
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 4);
                      }
                      else if (iVar44 == 4) {
                        *(undefined1 (*) [16])*pauVar49 = *(undefined1 (*) [16])*pauVar28;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      }
                      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                      iVar57 = iVar57 + -1;
                    } while (iVar57 != 0);
                  }
                  lVar20 = lVar52 + 4;
                  lVar33 = lVar52 + 7;
                  lVar52 = lVar20;
                } while (lVar33 < (long)local_78._0_8_);
              }
              uVar54 = (uint)lVar20;
              lVar52 = (long)iVar47;
              if ((int)(uVar54 | 1) < (int)uVar53) {
                lVar34 = (long)iVar21;
                lVar20 = local_258 + (long)(int)uVar54;
                lVar18 = lVar20 * 4 * lVar34 + lVar52 * 4;
                lVar19 = (lVar20 * 4 + 4) * lVar34 + lVar52 * 4;
                lVar32 = lVar34 * 4;
                lVar33 = (long)(int)uVar54;
                do {
                  pvVar7 = local_248->data;
                  if ((int)uVar58 < 0x10) {
                    uVar54 = 0;
                    lVar20 = lVar52 * 4 + (local_258 + lVar33) * lVar34 * 4;
                  }
                  else {
                    iVar44 = 0xf;
                    lVar20 = 0;
                    pauVar49 = pauVar28;
                    do {
                      pauVar27 = pauVar49;
                      pauVar49 = (undefined1 (*) [64])(*pauVar28 + lVar20 * 2);
                      auVar77 = vmovdqu64_avx512f(*pauVar49);
                      auVar78 = vmovdqu64_avx512f(pauVar49[1]);
                      auVar79 = vpunpckldq_avx512f(auVar77,auVar78);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar78);
                      auVar78 = vpunpcklqdq_avx512f(auVar79,auVar77);
                      auVar79 = vpermt2d_avx512f(auVar77,auVar74,auVar79);
                      auVar77 = vmovdqu64_avx512f(auVar78);
                      *(undefined1 (*) [64])((long)pvVar7 + lVar20 + lVar18) = auVar77;
                      auVar77 = vmovdqu64_avx512f(auVar79);
                      *(undefined1 (*) [64])((long)pvVar7 + lVar20 + lVar19) = auVar77;
                      lVar20 = lVar20 + 0x40;
                      iVar44 = iVar44 + 0x10;
                      pauVar49 = pauVar49 + 2;
                    } while (iVar44 < (int)uVar58);
                    pauVar28 = pauVar27 + 2;
                    lVar20 = lVar20 + lVar18;
                    uVar54 = uVar58 & 0xfffffff0;
                  }
                  pauVar61 = (undefined1 (*) [16])((long)pvVar7 + lVar20);
                  if ((int)(uVar54 | 7) < (int)uVar58) {
                    lVar35 = 0;
                    lVar20 = 0;
                    pauVar49 = pauVar28;
                    do {
                      pauVar27 = pauVar49;
                      lVar36 = lVar20;
                      pauVar1 = (undefined1 (*) [16])(*pauVar28 + lVar35 * 8);
                      auVar65 = vpermilps_avx(pauVar1[2],0xb1);
                      auVar62 = vpermilps_avx(pauVar1[3],0xb1);
                      auVar64 = vunpcklps_avx(*pauVar1,auVar65);
                      auVar63 = vunpckhps_avx(*pauVar1,auVar65);
                      auVar109 = vunpcklps_avx(pauVar1[1],auVar62);
                      auVar106 = vunpckhps_avx(pauVar1[1],auVar62);
                      auVar65 = vmovlhps_avx(auVar64,auVar63);
                      auVar62 = vmovlhps_avx(auVar109,auVar106);
                      auVar63 = vshufps_avx(auVar64,auVar63,0xbb);
                      auVar106 = vshufps_avx(auVar109,auVar106,0xbb);
                      *(undefined1 (*) [16])(*pauVar61 + lVar35 * 4) = auVar65;
                      *(undefined1 (*) [16])(pauVar61[1] + lVar35 * 4) = auVar62;
                      *(undefined1 (*) [16])(*pauVar61 + lVar35 * 4 + lVar32) = auVar63;
                      *(undefined1 (*) [16])(pauVar61[1] + lVar35 * 4 + lVar32) = auVar106;
                      lVar35 = lVar35 + 8;
                      lVar20 = lVar36 + 0x20;
                      pauVar49 = (undefined1 (*) [64])(pauVar1 + 4);
                    } while ((int)(uVar54 + (int)lVar35 + 7) < (int)uVar58);
                    pauVar28 = pauVar27 + 1;
                    pauVar61 = (undefined1 (*) [16])(pauVar61[2] + lVar36);
                    uVar54 = uVar54 + (int)lVar35;
                  }
                  uVar29 = uVar54 | 3;
                  while ((int)uVar29 < (int)uVar58) {
                    auVar63 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar28,
                                            *(undefined1 (*) [16])(*pauVar28 + 0x10));
                    auVar62 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar28,
                                            *(undefined1 (*) [16])(*pauVar28 + 0x10));
                    auVar65 = vmovlhps_avx(auVar63,auVar62);
                    auVar62 = vunpckhps_avx(auVar62,auVar63);
                    auVar62 = vshufps_avx(auVar62,auVar62,0x36);
                    *pauVar61 = auVar65;
                    *(undefined1 (*) [16])(*pauVar61 + lVar34 * 4) = auVar62;
                    pauVar61 = pauVar61 + 1;
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                    uVar29 = uVar54 + 7;
                    uVar54 = uVar54 + 4;
                  }
                  if ((int)(uVar54 | 1) < (int)uVar58) {
                    lVar20 = 0;
                    lVar36 = 0;
                    lVar35 = 0;
                    do {
                      uVar4 = *(undefined4 *)(*pauVar28 + lVar35 * 8 + 8);
                      uVar5 = *(undefined4 *)(*pauVar28 + lVar35 * 8 + 0xc);
                      *(undefined8 *)(*pauVar61 + lVar35 * 4) =
                           *(undefined8 *)(*pauVar28 + lVar35 * 8);
                      *(undefined4 *)(*pauVar61 + lVar35 * 4 + lVar32) = uVar4;
                      *(undefined4 *)
                       (*pauVar61 + lVar35 * 4 + ((long)((sVar6 << 0x20) + 0x100000000) >> 0x20) * 4
                       ) = uVar5;
                      lVar35 = lVar35 + 2;
                      lVar36 = lVar36 + 0x10;
                      lVar20 = lVar20 + 8;
                    } while ((int)((int)lVar35 + uVar54 + 1) < (int)uVar58);
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + lVar36);
                    pauVar61 = (undefined1 (*) [16])(*pauVar61 + lVar20);
                    uVar54 = uVar54 + (int)lVar35;
                  }
                  if ((int)uVar54 < (int)uVar58) {
                    lVar20 = 0;
                    do {
                      uVar4 = *(undefined4 *)(*pauVar28 + 4);
                      *(undefined4 *)(*pauVar61 + lVar20 * 4) = *(undefined4 *)*pauVar28;
                      *(undefined4 *)(*pauVar61 + lVar20 * 4 + lVar32) = uVar4;
                      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                      lVar20 = lVar20 + 1;
                    } while (uVar58 - uVar54 != (int)lVar20);
                  }
                  lVar20 = lVar33 + 2;
                  lVar35 = lVar33 + 3;
                  lVar18 = lVar18 + lVar34 * 8;
                  lVar19 = lVar19 + lVar34 * 8;
                  lVar33 = lVar20;
                  uVar17 = local_238;
                } while (lVar35 < (long)local_78._0_8_);
              }
              if ((int)lVar20 < (int)uVar53) {
                lVar20 = (long)(int)lVar20;
                do {
                  pauVar49 = (undefined1 (*) [64])
                             ((long)local_248->data +
                             lVar52 * 4 + (local_258 + lVar20) * (long)iVar21 * 4);
                  uVar54 = 0;
                  if (0xf < (int)uVar58) {
                    iVar44 = 0xf;
                    do {
                      *pauVar49 = *pauVar28;
                      pauVar49 = pauVar49 + 1;
                      pauVar28 = pauVar28 + 1;
                      iVar44 = iVar44 + 0x10;
                      uVar54 = uVar58 & 0xfffffff0;
                    } while (iVar44 < (int)uVar58);
                  }
                  uVar29 = uVar54 | 7;
                  while ((int)uVar29 < (int)uVar58) {
                    *(undefined1 (*) [32])*pauVar49 = *(undefined1 (*) [32])*pauVar28;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
                    uVar29 = uVar54 + 0xf;
                    uVar54 = uVar54 + 8;
                  }
                  uVar29 = uVar54 | 3;
                  while ((int)uVar29 < (int)uVar58) {
                    *(undefined1 (*) [16])*pauVar49 = *(undefined1 (*) [16])*pauVar28;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
                    uVar29 = uVar54 + 7;
                    uVar54 = uVar54 + 4;
                  }
                  uVar29 = uVar54 | 1;
                  while ((int)uVar29 < (int)uVar58) {
                    *(undefined8 *)*pauVar49 = *(undefined8 *)*pauVar28;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 8);
                    pauVar28 = (undefined1 (*) [64])(*pauVar28 + 8);
                    uVar29 = uVar54 + 3;
                    uVar54 = uVar54 + 2;
                  }
                  if ((int)uVar54 < (int)uVar58) {
                    lVar18 = 0;
                    do {
                      *(undefined4 *)(*pauVar49 + lVar18 * 4) = *(undefined4 *)*pauVar28;
                      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
                      lVar18 = lVar18 + 1;
                    } while (uVar58 - uVar54 != (int)lVar18);
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 != local_78._0_8_);
              }
              iVar47 = iVar47 + TILE_N;
            } while (iVar47 < (int)local_1e0);
            if (m.refcount != (int *)0x0) {
              LOCK();
              *m.refcount = *m.refcount + -1;
              UNLOCK();
              if (*m.refcount == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  if (m.data != (void *)0x0) {
                    free(m.data);
                  }
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != local_22c);
      }
      iVar44 = 0;
    }
    piVar13 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if (local_228.data != (void *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar13 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

static int convolution_im2col_gemm_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile_int8(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                convolution_gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_int32(topT_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}